

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::SubGridMBIntersectorKPluecker<4,_8,_true>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  BBox1f BVar1;
  ushort uVar2;
  ushort uVar3;
  Geometry *pGVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  RayK<8> *pRVar59;
  RayQueryContext *pRVar60;
  int iVar61;
  AABBNodeMB4D *node1;
  ulong uVar62;
  long lVar63;
  ulong uVar64;
  long lVar65;
  ulong uVar66;
  uint uVar67;
  ulong uVar68;
  long lVar69;
  long lVar70;
  ulong uVar71;
  ulong uVar72;
  undefined1 (*pauVar73) [32];
  NodeRef NVar74;
  ulong *puVar75;
  undefined4 uVar76;
  ulong unaff_R14;
  long lVar77;
  bool bVar78;
  undefined1 auVar83 [16];
  float fVar79;
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar80 [16];
  undefined1 auVar86 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar93;
  float fVar108;
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar96 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar106;
  float fVar107;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 in_ZMM1 [64];
  undefined1 auVar105 [64];
  undefined1 auVar112 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar113 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar129 [16];
  undefined1 auVar138 [32];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar143 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar159 [16];
  undefined1 auVar163 [32];
  undefined1 auVar160 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar171 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar191 [16];
  float fVar190;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar201;
  undefined1 auVar202 [16];
  float fVar208;
  float fVar209;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar210;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  float fVar214;
  undefined1 auVar215 [32];
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 in_ZMM13 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  Precalculations pre;
  UVIdentity<8> mapUV;
  float old_t;
  vbool<8> terminated;
  RTCFilterFunctionNArguments args;
  vbool<8> valid0;
  TravRayK<8,_true> tray;
  vint<8> itime;
  vfloat<8> ftime;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2f3a;
  undefined1 local_2f39;
  undefined1 (*local_2f38) [32];
  NodeRef local_2f30;
  ulong local_2f28;
  ulong local_2f20;
  uint local_2f14;
  uint local_2f10;
  uint local_2f0c;
  RayK<8> *local_2f08;
  undefined1 local_2f00 [32];
  undefined1 local_2ee0 [32];
  undefined1 local_2ec0 [8];
  float fStack_2eb8;
  float fStack_2eb4;
  float fStack_2eb0;
  float fStack_2eac;
  float fStack_2ea8;
  float fStack_2ea4;
  undefined1 local_2ea0 [32];
  BVH *local_2e78;
  Intersectors *local_2e70;
  long local_2e68;
  long local_2e60;
  long local_2e58;
  ulong local_2e50;
  RayK<8> *local_2e48;
  RayQueryContext *local_2e40;
  ulong *local_2e38;
  ulong local_2e30;
  ulong local_2e28;
  ulong local_2e20;
  long local_2e18;
  long local_2e10;
  Scene *local_2e08;
  undefined1 local_2e00 [32];
  undefined1 local_2de0 [32];
  undefined1 local_2dc0 [32];
  undefined1 local_2da0 [32];
  RTCFilterFunctionNArguments local_2d70;
  undefined1 local_2d40 [32];
  undefined1 local_2d20 [32];
  undefined1 local_2d00 [32];
  undefined1 local_2ce0 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2cc0;
  undefined1 local_2c60 [32];
  undefined1 local_2c40 [32];
  undefined1 local_2c20 [32];
  undefined1 local_2c00 [8];
  float fStack_2bf8;
  float fStack_2bf4;
  float fStack_2bf0;
  float fStack_2bec;
  float fStack_2be8;
  undefined1 local_2be0 [8];
  float fStack_2bd8;
  float fStack_2bd4;
  float fStack_2bd0;
  float fStack_2bcc;
  float fStack_2bc8;
  undefined1 local_2bc0 [8];
  float fStack_2bb8;
  float fStack_2bb4;
  float fStack_2bb0;
  float fStack_2bac;
  float fStack_2ba8;
  undefined1 local_2ba0 [32];
  undefined1 local_2b80 [32];
  undefined1 local_2b60 [32];
  undefined1 local_2b40 [32];
  undefined1 local_2b20 [32];
  undefined1 local_2b00 [32];
  undefined1 local_2ae0 [32];
  undefined1 local_2ac0 [32];
  undefined1 *local_2aa0;
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  float local_29e0 [4];
  float fStack_29d0;
  float fStack_29cc;
  float fStack_29c8;
  undefined4 uStack_29c4;
  float local_29c0 [4];
  float fStack_29b0;
  float fStack_29ac;
  float fStack_29a8;
  undefined4 uStack_29a4;
  RTCHitN local_29a0 [32];
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined4 local_2940;
  undefined4 uStack_293c;
  undefined4 uStack_2938;
  undefined4 uStack_2934;
  undefined4 uStack_2930;
  undefined4 uStack_292c;
  undefined4 uStack_2928;
  undefined4 uStack_2924;
  undefined4 local_2920;
  undefined4 uStack_291c;
  undefined4 uStack_2918;
  undefined4 uStack_2914;
  undefined4 uStack_2910;
  undefined4 uStack_290c;
  undefined4 uStack_2908;
  undefined4 uStack_2904;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  uint local_28c0;
  uint uStack_28bc;
  uint uStack_28b8;
  uint uStack_28b4;
  uint uStack_28b0;
  uint uStack_28ac;
  uint uStack_28a8;
  uint uStack_28a4;
  uint local_28a0;
  uint uStack_289c;
  uint uStack_2898;
  uint uStack_2894;
  uint uStack_2890;
  uint uStack_288c;
  uint uStack_2888;
  uint uStack_2884;
  undefined1 local_2880 [32];
  undefined1 local_2860 [8];
  float fStack_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  float fStack_2848;
  undefined1 local_2840 [8];
  float fStack_2838;
  float fStack_2834;
  float fStack_2830;
  float fStack_282c;
  float fStack_2828;
  uint local_2820;
  uint uStack_281c;
  uint uStack_2818;
  uint uStack_2814;
  uint uStack_2810;
  uint uStack_280c;
  uint uStack_2808;
  uint uStack_2804;
  uint local_2800;
  uint uStack_27fc;
  uint uStack_27f8;
  uint uStack_27f4;
  uint uStack_27f0;
  uint uStack_27ec;
  uint uStack_27e8;
  uint uStack_27e4;
  float local_27e0;
  float fStack_27dc;
  float fStack_27d8;
  float fStack_27d4;
  float fStack_27d0;
  float fStack_27cc;
  float fStack_27c8;
  undefined4 uStack_27c4;
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined4 local_1e80;
  undefined4 uStack_1e7c;
  undefined4 uStack_1e78;
  undefined4 uStack_1e74;
  undefined4 uStack_1e70;
  undefined4 uStack_1e6c;
  undefined4 uStack_1e68;
  undefined4 uStack_1e64;
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  local_2e78 = (BVH *)This->ptr;
  local_2608 = (local_2e78->root).ptr;
  if (local_2608 != 8) {
    auVar134 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar80 = ZEXT816(0) << 0x40;
    auVar99 = vpcmpeqd_avx2(auVar134,(undefined1  [32])valid_i->field_0);
    auVar134 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar80),5);
    auVar114 = auVar99 & auVar134;
    if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar114 >> 0x7f,0) != '\0') ||
          (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar114 >> 0xbf,0) != '\0') ||
        (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar114[0x1f] < '\0') {
      auVar134 = vandps_avx(auVar134,auVar99);
      auVar94 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
      local_2cc0._0_8_ = *(undefined8 *)ray;
      local_2cc0._8_8_ = *(undefined8 *)(ray + 8);
      local_2cc0._16_8_ = *(undefined8 *)(ray + 0x10);
      local_2cc0._24_8_ = *(undefined8 *)(ray + 0x18);
      local_2cc0._32_8_ = *(undefined8 *)(ray + 0x20);
      local_2cc0._40_8_ = *(undefined8 *)(ray + 0x28);
      local_2cc0._48_8_ = *(undefined8 *)(ray + 0x30);
      local_2cc0._56_8_ = *(undefined8 *)(ray + 0x38);
      local_2cc0._64_8_ = *(undefined8 *)(ray + 0x40);
      local_2cc0._72_8_ = *(undefined8 *)(ray + 0x48);
      local_2cc0._80_8_ = *(undefined8 *)(ray + 0x50);
      local_2cc0._88_8_ = *(undefined8 *)(ray + 0x58);
      local_2c60 = *(undefined1 (*) [32])(ray + 0x80);
      local_2c40 = *(undefined1 (*) [32])(ray + 0xa0);
      local_2c20 = *(undefined1 (*) [32])(ray + 0xc0);
      local_2d00._8_4_ = 0x7fffffff;
      local_2d00._0_8_ = 0x7fffffff7fffffff;
      local_2d00._12_4_ = 0x7fffffff;
      local_2d00._16_4_ = 0x7fffffff;
      local_2d00._20_4_ = 0x7fffffff;
      local_2d00._24_4_ = 0x7fffffff;
      local_2d00._28_4_ = 0x7fffffff;
      auVar203._8_4_ = 0x219392ef;
      auVar203._0_8_ = 0x219392ef219392ef;
      auVar203._12_4_ = 0x219392ef;
      auVar203._16_4_ = 0x219392ef;
      auVar203._20_4_ = 0x219392ef;
      auVar203._24_4_ = 0x219392ef;
      auVar203._28_4_ = 0x219392ef;
      auVar211._8_4_ = 0x3f800000;
      auVar211._0_8_ = 0x3f8000003f800000;
      auVar211._12_4_ = 0x3f800000;
      auVar211._16_4_ = 0x3f800000;
      auVar211._20_4_ = 0x3f800000;
      auVar211._24_4_ = 0x3f800000;
      auVar211._28_4_ = 0x3f800000;
      auVar132 = vdivps_avx(auVar211,local_2c60);
      auVar134 = vandps_avx(local_2d00,local_2c60);
      auVar114 = vcmpps_avx(auVar134,auVar203,1);
      auVar134 = vandps_avx(local_2d00,local_2c40);
      auVar99 = vcmpps_avx(auVar134,auVar203,1);
      auVar133 = vdivps_avx(auVar211,local_2c40);
      auVar134 = vandps_avx(local_2d00,local_2c20);
      auVar134 = vcmpps_avx(auVar134,auVar203,1);
      auVar144 = vdivps_avx(auVar211,local_2c20);
      auVar204._8_4_ = 0x5d5e0b6b;
      auVar204._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar204._12_4_ = 0x5d5e0b6b;
      auVar204._16_4_ = 0x5d5e0b6b;
      auVar204._20_4_ = 0x5d5e0b6b;
      auVar204._24_4_ = 0x5d5e0b6b;
      auVar204._28_4_ = 0x5d5e0b6b;
      _local_2c00 = vblendvps_avx(auVar132,auVar204,auVar114);
      _local_2be0 = vblendvps_avx(auVar133,auVar204,auVar99);
      _local_2bc0 = vblendvps_avx(auVar144,auVar204,auVar134);
      auVar134 = vcmpps_avx(_local_2c00,ZEXT1632(auVar80),1);
      auVar114._8_4_ = 0x10;
      auVar114._0_8_ = 0x1000000010;
      auVar114._12_4_ = 0x10;
      auVar114._16_4_ = 0x10;
      auVar114._20_4_ = 0x10;
      auVar114._24_4_ = 0x10;
      auVar114._28_4_ = 0x10;
      local_2ba0 = vandps_avx(auVar134,auVar114);
      auVar132._8_4_ = 0x20;
      auVar132._0_8_ = 0x2000000020;
      auVar132._12_4_ = 0x20;
      auVar132._16_4_ = 0x20;
      auVar132._20_4_ = 0x20;
      auVar132._24_4_ = 0x20;
      auVar132._28_4_ = 0x20;
      auVar172._8_4_ = 0x30;
      auVar172._0_8_ = 0x3000000030;
      auVar172._12_4_ = 0x30;
      auVar172._16_4_ = 0x30;
      auVar172._20_4_ = 0x30;
      auVar172._24_4_ = 0x30;
      auVar172._28_4_ = 0x30;
      auVar114 = ZEXT1632(auVar80);
      auVar134 = vcmpps_avx(_local_2be0,auVar114,5);
      local_2b80 = vblendvps_avx(auVar172,auVar132,auVar134);
      auVar133._8_4_ = 0x40;
      auVar133._0_8_ = 0x4000000040;
      auVar133._12_4_ = 0x40;
      auVar133._16_4_ = 0x40;
      auVar133._20_4_ = 0x40;
      auVar133._24_4_ = 0x40;
      auVar133._28_4_ = 0x40;
      auVar144._8_4_ = 0x50;
      auVar144._0_8_ = 0x5000000050;
      auVar144._12_4_ = 0x50;
      auVar144._16_4_ = 0x50;
      auVar144._20_4_ = 0x50;
      auVar144._24_4_ = 0x50;
      auVar144._28_4_ = 0x50;
      auVar134 = vcmpps_avx(_local_2bc0,auVar114,5);
      local_2b60 = vblendvps_avx(auVar144,auVar133,auVar134);
      auVar134 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar114);
      auVar114 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar114);
      local_2880 = vpmovsxwd_avx2(auVar94);
      auVar99._8_4_ = 0x7f800000;
      auVar99._0_8_ = 0x7f8000007f800000;
      auVar99._12_4_ = 0x7f800000;
      auVar99._16_4_ = 0x7f800000;
      auVar99._20_4_ = 0x7f800000;
      auVar99._24_4_ = 0x7f800000;
      auVar99._28_4_ = 0x7f800000;
      local_2b40 = vblendvps_avx(auVar99,auVar134,local_2880);
      auVar134._8_4_ = 0xff800000;
      auVar134._0_8_ = 0xff800000ff800000;
      auVar134._12_4_ = 0xff800000;
      auVar134._16_4_ = 0xff800000;
      auVar134._20_4_ = 0xff800000;
      auVar134._24_4_ = 0xff800000;
      auVar134._28_4_ = 0xff800000;
      local_2b20 = vblendvps_avx(auVar134,auVar114,local_2880);
      auVar80 = vpcmpeqd_avx(local_2b20._0_16_,local_2b20._0_16_);
      local_2e00 = vpmovsxwd_avx2(auVar94 ^ auVar80);
      if (context->user == (RTCRayQueryContext *)0x0) {
        local_2f20 = 5;
      }
      else {
        local_2f20 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                            RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2f08 = ray + 0x100;
      puVar75 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      local_1e80 = 0x7f800000;
      uStack_1e7c = 0x7f800000;
      uStack_1e78 = 0x7f800000;
      uStack_1e74 = 0x7f800000;
      uStack_1e70 = 0x7f800000;
      uStack_1e6c = 0x7f800000;
      uStack_1e68 = 0x7f800000;
      uStack_1e64 = 0x7f800000;
      local_27a0._16_16_ = mm_lookupmask_ps._240_16_;
      local_27a0._0_16_ = mm_lookupmask_ps._0_16_;
      local_1e60 = local_2b40;
      auVar85._8_4_ = 0xbf800000;
      auVar85._0_8_ = 0xbf800000bf800000;
      auVar85._12_4_ = 0xbf800000;
      auVar85._16_4_ = 0xbf800000;
      auVar85._20_4_ = 0xbf800000;
      auVar85._24_4_ = 0xbf800000;
      auVar85._28_4_ = 0xbf800000;
      auVar98._8_4_ = 0x3f800000;
      auVar98._0_8_ = 0x3f8000003f800000;
      auVar98._12_4_ = 0x3f800000;
      auVar98._16_4_ = 0x3f800000;
      auVar98._20_4_ = 0x3f800000;
      auVar98._24_4_ = 0x3f800000;
      auVar98._28_4_ = 0x3f800000;
      local_27c0 = vblendvps_avx(auVar98,auVar85,local_27a0);
      pauVar73 = (undefined1 (*) [32])local_1e40;
      local_2e70 = This;
      local_2e48 = ray;
      local_2e40 = context;
LAB_015d7fc4:
      do {
        do {
          local_2f30.ptr = puVar75[-1];
          if (local_2f30.ptr == 0xfffffffffffffff8) goto LAB_015d94d1;
          puVar75 = puVar75 + -1;
          local_2f38 = pauVar73 + -1;
          auVar134 = *local_2f38;
          auVar114 = vcmpps_avx(auVar134,local_2b20,1);
          pauVar73 = local_2f38;
        } while ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar114 >> 0x7f,0) == '\0') &&
                   (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar114 >> 0xbf,0) == '\0') &&
                 (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar114[0x1f]);
        uVar76 = vmovmskps_avx(auVar114);
        unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar76);
        if (local_2f20 < (uint)POPCOUNT(uVar76)) {
LAB_015d800e:
          auVar105 = ZEXT3264(auVar134);
          pauVar73 = local_2f38;
          do {
            uVar67 = (uint)local_2f30.ptr;
            if ((local_2f30.ptr & 8) != 0) {
              if (local_2f30.ptr == 0xfffffffffffffff8) goto LAB_015d94d1;
              auVar134 = vcmpps_avx(local_2b20,auVar105._0_32_,6);
              if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar134 >> 0x7f,0) != '\0') ||
                    (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar134 >> 0xbf,0) != '\0') ||
                  (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar134[0x1f] < '\0') {
                local_2e68 = (ulong)(uVar67 & 0xf) - 8;
                NVar74.ptr = local_2f30.ptr & 0xfffffffffffffff0;
                auVar134 = vpcmpeqd_avx2(auVar134,auVar134);
                lVar69 = 0;
                uVar62 = local_2f20;
                auVar134 = auVar134 ^ local_2e00;
                local_2f38 = pauVar73;
                local_2f30.ptr = NVar74.ptr;
                local_2e38 = puVar75;
                while (lVar69 != local_2e68) {
                  lVar63 = lVar69 * 0x90;
                  auVar80._8_8_ = 0;
                  auVar80._0_8_ = *(ulong *)(NVar74.ptr + 0x20 + lVar63);
                  auVar94._8_8_ = 0;
                  auVar94._0_8_ = *(ulong *)(NVar74.ptr + 0x24 + lVar63);
                  auVar94 = vpminub_avx(auVar80,auVar94);
                  auVar80 = vpcmpeqb_avx(auVar80,auVar94);
                  auVar94 = vpcmpeqd_avx(auVar94,auVar94);
                  auVar105 = ZEXT1664(auVar94);
                  auVar80 = vpmovzxbd_avx(auVar80 ^ auVar94);
                  auVar80 = vpslld_avx(auVar80 ^ auVar94,0x1f);
                  uVar67 = vmovmskps_avx(auVar80);
                  local_2e60 = lVar69;
                  local_2d40 = auVar134;
                  if (uVar67 != 0) {
                    lVar69 = NVar74.ptr + lVar63;
                    uVar76 = *(undefined4 *)(NVar74.ptr + 0x80 + lVar63);
                    auVar86._4_4_ = uVar76;
                    auVar86._0_4_ = uVar76;
                    auVar86._8_4_ = uVar76;
                    auVar86._12_4_ = uVar76;
                    auVar86._16_4_ = uVar76;
                    auVar86._20_4_ = uVar76;
                    auVar86._24_4_ = uVar76;
                    auVar86._28_4_ = uVar76;
                    auVar134 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar86);
                    fVar79 = *(float *)(NVar74.ptr + 0x84 + lVar63);
                    local_27e0 = fVar79 * auVar134._0_4_;
                    fStack_27dc = fVar79 * auVar134._4_4_;
                    fStack_27d8 = fVar79 * auVar134._8_4_;
                    fStack_27d4 = fVar79 * auVar134._12_4_;
                    fStack_27d0 = fVar79 * auVar134._16_4_;
                    fStack_27cc = fVar79 * auVar134._20_4_;
                    fStack_27c8 = fVar79 * auVar134._24_4_;
                    uStack_27c4 = auVar134._28_4_;
                    uVar68 = (ulong)(uVar67 & 0xff);
                    local_2e58 = lVar69;
                    do {
                      lVar63 = 0;
                      for (uVar66 = uVar68; (uVar66 & 1) == 0;
                          uVar66 = uVar66 >> 1 | 0x8000000000000000) {
                        lVar63 = lVar63 + 1;
                      }
                      auVar81._8_8_ = 0;
                      auVar81._0_8_ = *(ulong *)(lVar69 + 0x20);
                      auVar80 = vpmovzxbd_avx(auVar81);
                      auVar80 = vcvtdq2ps_avx(auVar80);
                      uVar76 = *(undefined4 *)(lVar69 + 0x44);
                      auVar95._4_4_ = uVar76;
                      auVar95._0_4_ = uVar76;
                      auVar95._8_4_ = uVar76;
                      auVar95._12_4_ = uVar76;
                      uVar76 = *(undefined4 *)(lVar69 + 0x38);
                      auVar112._4_4_ = uVar76;
                      auVar112._0_4_ = uVar76;
                      auVar112._8_4_ = uVar76;
                      auVar112._12_4_ = uVar76;
                      auVar80 = vfmadd213ps_fma(auVar80,auVar95,auVar112);
                      local_2b00._0_16_ = auVar80;
                      uVar67 = (int)lVar63 * 4;
                      fVar79 = *(float *)(local_2b00 + uVar67);
                      auVar137._4_4_ = fVar79;
                      auVar137._0_4_ = fVar79;
                      auVar137._8_4_ = fVar79;
                      auVar137._12_4_ = fVar79;
                      auVar137._16_4_ = fVar79;
                      auVar137._20_4_ = fVar79;
                      auVar137._24_4_ = fVar79;
                      auVar137._28_4_ = fVar79;
                      auVar82._8_8_ = 0;
                      auVar82._0_8_ = *(ulong *)(lVar69 + 0x50);
                      auVar80 = vpmovzxbd_avx(auVar82);
                      auVar80 = vcvtdq2ps_avx(auVar80);
                      uVar76 = *(undefined4 *)(lVar69 + 0x74);
                      auVar141._4_4_ = uVar76;
                      auVar141._0_4_ = uVar76;
                      auVar141._8_4_ = uVar76;
                      auVar141._12_4_ = uVar76;
                      uVar76 = *(undefined4 *)(lVar69 + 0x68);
                      auVar157._4_4_ = uVar76;
                      auVar157._0_4_ = uVar76;
                      auVar157._8_4_ = uVar76;
                      auVar157._12_4_ = uVar76;
                      auVar80 = vfmadd213ps_fma(auVar80,auVar141,auVar157);
                      local_29a0[0] = (RTCHitN)auVar80[0];
                      local_29a0[1] = (RTCHitN)auVar80[1];
                      local_29a0[2] = (RTCHitN)auVar80[2];
                      local_29a0[3] = (RTCHitN)auVar80[3];
                      local_29a0[4] = (RTCHitN)auVar80[4];
                      local_29a0[5] = (RTCHitN)auVar80[5];
                      local_29a0[6] = (RTCHitN)auVar80[6];
                      local_29a0[7] = (RTCHitN)auVar80[7];
                      local_29a0[8] = (RTCHitN)auVar80[8];
                      local_29a0[9] = (RTCHitN)auVar80[9];
                      local_29a0[10] = (RTCHitN)auVar80[10];
                      local_29a0[0xb] = (RTCHitN)auVar80[0xb];
                      local_29a0[0xc] = (RTCHitN)auVar80[0xc];
                      local_29a0[0xd] = (RTCHitN)auVar80[0xd];
                      local_29a0[0xe] = (RTCHitN)auVar80[0xe];
                      local_29a0[0xf] = (RTCHitN)auVar80[0xf];
                      fVar79 = *(float *)(local_29a0 + uVar67) - fVar79;
                      auVar87._4_4_ = fVar79;
                      auVar87._0_4_ = fVar79;
                      auVar87._8_4_ = fVar79;
                      auVar87._12_4_ = fVar79;
                      auVar87._16_4_ = fVar79;
                      auVar87._20_4_ = fVar79;
                      auVar87._24_4_ = fVar79;
                      auVar87._28_4_ = fVar79;
                      auVar58._4_4_ = fStack_27dc;
                      auVar58._0_4_ = local_27e0;
                      auVar58._8_4_ = fStack_27d8;
                      auVar58._12_4_ = fStack_27d4;
                      auVar58._16_4_ = fStack_27d0;
                      auVar58._20_4_ = fStack_27cc;
                      auVar58._24_4_ = fStack_27c8;
                      auVar58._28_4_ = uStack_27c4;
                      auVar94 = vfmadd213ps_fma(auVar87,auVar58,auVar137);
                      auVar128._8_8_ = 0;
                      auVar128._0_8_ = *(ulong *)(lVar69 + 0x24);
                      auVar80 = vpmovzxbd_avx(auVar128);
                      auVar80 = vcvtdq2ps_avx(auVar80);
                      local_2b00._0_16_ = vfmadd213ps_fma(auVar80,auVar95,auVar112);
                      fVar79 = *(float *)(local_2b00 + uVar67);
                      auVar117._4_4_ = fVar79;
                      auVar117._0_4_ = fVar79;
                      auVar117._8_4_ = fVar79;
                      auVar117._12_4_ = fVar79;
                      auVar117._16_4_ = fVar79;
                      auVar117._20_4_ = fVar79;
                      auVar117._24_4_ = fVar79;
                      auVar117._28_4_ = fVar79;
                      auVar96._8_8_ = 0;
                      auVar96._0_8_ = *(ulong *)(lVar69 + 0x54);
                      auVar80 = vpmovzxbd_avx(auVar96);
                      auVar80 = vcvtdq2ps_avx(auVar80);
                      auVar80 = vfmadd213ps_fma(auVar80,auVar141,auVar157);
                      local_29a0[0] = (RTCHitN)auVar80[0];
                      local_29a0[1] = (RTCHitN)auVar80[1];
                      local_29a0[2] = (RTCHitN)auVar80[2];
                      local_29a0[3] = (RTCHitN)auVar80[3];
                      local_29a0[4] = (RTCHitN)auVar80[4];
                      local_29a0[5] = (RTCHitN)auVar80[5];
                      local_29a0[6] = (RTCHitN)auVar80[6];
                      local_29a0[7] = (RTCHitN)auVar80[7];
                      local_29a0[8] = (RTCHitN)auVar80[8];
                      local_29a0[9] = (RTCHitN)auVar80[9];
                      local_29a0[10] = (RTCHitN)auVar80[10];
                      local_29a0[0xb] = (RTCHitN)auVar80[0xb];
                      local_29a0[0xc] = (RTCHitN)auVar80[0xc];
                      local_29a0[0xd] = (RTCHitN)auVar80[0xd];
                      local_29a0[0xe] = (RTCHitN)auVar80[0xe];
                      local_29a0[0xf] = (RTCHitN)auVar80[0xf];
                      fVar79 = *(float *)(local_29a0 + uVar67) - fVar79;
                      auVar100._4_4_ = fVar79;
                      auVar100._0_4_ = fVar79;
                      auVar100._8_4_ = fVar79;
                      auVar100._12_4_ = fVar79;
                      auVar100._16_4_ = fVar79;
                      auVar100._20_4_ = fVar79;
                      auVar100._24_4_ = fVar79;
                      auVar100._28_4_ = fVar79;
                      auVar129._8_8_ = 0;
                      auVar129._0_8_ = *(ulong *)(lVar69 + 0x28);
                      auVar80 = vpmovzxbd_avx(auVar129);
                      auVar80 = vcvtdq2ps_avx(auVar80);
                      uVar76 = *(undefined4 *)(lVar69 + 0x48);
                      auVar142._4_4_ = uVar76;
                      auVar142._0_4_ = uVar76;
                      auVar142._8_4_ = uVar76;
                      auVar142._12_4_ = uVar76;
                      uVar76 = *(undefined4 *)(lVar69 + 0x3c);
                      auVar158._4_4_ = uVar76;
                      auVar158._0_4_ = uVar76;
                      auVar158._8_4_ = uVar76;
                      auVar158._12_4_ = uVar76;
                      local_2b00._0_16_ = vfmadd213ps_fma(auVar80,auVar142,auVar158);
                      fVar79 = *(float *)(local_2b00 + uVar67);
                      auVar138._4_4_ = fVar79;
                      auVar138._0_4_ = fVar79;
                      auVar138._8_4_ = fVar79;
                      auVar138._12_4_ = fVar79;
                      auVar138._16_4_ = fVar79;
                      auVar138._20_4_ = fVar79;
                      auVar138._24_4_ = fVar79;
                      auVar138._28_4_ = fVar79;
                      auVar81 = vfmadd213ps_fma(auVar100,auVar58,auVar117);
                      auVar113._8_8_ = 0;
                      auVar113._0_8_ = *(ulong *)(lVar69 + 0x58);
                      auVar80 = vpmovzxbd_avx(auVar113);
                      auVar80 = vcvtdq2ps_avx(auVar80);
                      uVar76 = *(undefined4 *)(lVar69 + 0x78);
                      auVar169._4_4_ = uVar76;
                      auVar169._0_4_ = uVar76;
                      auVar169._8_4_ = uVar76;
                      auVar169._12_4_ = uVar76;
                      uVar76 = *(undefined4 *)(lVar69 + 0x6c);
                      auVar182._4_4_ = uVar76;
                      auVar182._0_4_ = uVar76;
                      auVar182._8_4_ = uVar76;
                      auVar182._12_4_ = uVar76;
                      auVar80 = vfmadd213ps_fma(auVar80,auVar169,auVar182);
                      local_29a0[0] = (RTCHitN)auVar80[0];
                      local_29a0[1] = (RTCHitN)auVar80[1];
                      local_29a0[2] = (RTCHitN)auVar80[2];
                      local_29a0[3] = (RTCHitN)auVar80[3];
                      local_29a0[4] = (RTCHitN)auVar80[4];
                      local_29a0[5] = (RTCHitN)auVar80[5];
                      local_29a0[6] = (RTCHitN)auVar80[6];
                      local_29a0[7] = (RTCHitN)auVar80[7];
                      local_29a0[8] = (RTCHitN)auVar80[8];
                      local_29a0[9] = (RTCHitN)auVar80[9];
                      local_29a0[10] = (RTCHitN)auVar80[10];
                      local_29a0[0xb] = (RTCHitN)auVar80[0xb];
                      local_29a0[0xc] = (RTCHitN)auVar80[0xc];
                      local_29a0[0xd] = (RTCHitN)auVar80[0xd];
                      local_29a0[0xe] = (RTCHitN)auVar80[0xe];
                      local_29a0[0xf] = (RTCHitN)auVar80[0xf];
                      fVar79 = *(float *)(local_29a0 + uVar67) - fVar79;
                      auVar118._4_4_ = fVar79;
                      auVar118._0_4_ = fVar79;
                      auVar118._8_4_ = fVar79;
                      auVar118._12_4_ = fVar79;
                      auVar118._16_4_ = fVar79;
                      auVar118._20_4_ = fVar79;
                      auVar118._24_4_ = fVar79;
                      auVar118._28_4_ = fVar79;
                      auVar82 = vfmadd213ps_fma(auVar118,auVar58,auVar138);
                      auVar130._8_8_ = 0;
                      auVar130._0_8_ = *(ulong *)(lVar69 + 0x2c);
                      auVar80 = vpmovzxbd_avx(auVar130);
                      auVar80 = vcvtdq2ps_avx(auVar80);
                      local_2b00._0_16_ = vfmadd213ps_fma(auVar80,auVar142,auVar158);
                      fVar79 = *(float *)(local_2b00 + uVar67);
                      auVar151._4_4_ = fVar79;
                      auVar151._0_4_ = fVar79;
                      auVar151._8_4_ = fVar79;
                      auVar151._12_4_ = fVar79;
                      auVar151._16_4_ = fVar79;
                      auVar151._20_4_ = fVar79;
                      auVar151._24_4_ = fVar79;
                      auVar151._28_4_ = fVar79;
                      auVar131._8_8_ = 0;
                      auVar131._0_8_ = *(ulong *)(lVar69 + 0x5c);
                      auVar80 = vpmovzxbd_avx(auVar131);
                      auVar80 = vcvtdq2ps_avx(auVar80);
                      auVar80 = vfmadd213ps_fma(auVar80,auVar169,auVar182);
                      local_29a0[0] = (RTCHitN)auVar80[0];
                      local_29a0[1] = (RTCHitN)auVar80[1];
                      local_29a0[2] = (RTCHitN)auVar80[2];
                      local_29a0[3] = (RTCHitN)auVar80[3];
                      local_29a0[4] = (RTCHitN)auVar80[4];
                      local_29a0[5] = (RTCHitN)auVar80[5];
                      local_29a0[6] = (RTCHitN)auVar80[6];
                      local_29a0[7] = (RTCHitN)auVar80[7];
                      local_29a0[8] = (RTCHitN)auVar80[8];
                      local_29a0[9] = (RTCHitN)auVar80[9];
                      local_29a0[10] = (RTCHitN)auVar80[10];
                      local_29a0[0xb] = (RTCHitN)auVar80[0xb];
                      local_29a0[0xc] = (RTCHitN)auVar80[0xc];
                      local_29a0[0xd] = (RTCHitN)auVar80[0xd];
                      local_29a0[0xe] = (RTCHitN)auVar80[0xe];
                      local_29a0[0xf] = (RTCHitN)auVar80[0xf];
                      fVar79 = *(float *)(local_29a0 + uVar67) - fVar79;
                      auVar139._4_4_ = fVar79;
                      auVar139._0_4_ = fVar79;
                      auVar139._8_4_ = fVar79;
                      auVar139._12_4_ = fVar79;
                      auVar139._16_4_ = fVar79;
                      auVar139._20_4_ = fVar79;
                      auVar139._24_4_ = fVar79;
                      auVar139._28_4_ = fVar79;
                      auVar159._8_8_ = 0;
                      auVar159._0_8_ = *(ulong *)(lVar69 + 0x30);
                      auVar80 = vpmovzxbd_avx(auVar159);
                      auVar80 = vcvtdq2ps_avx(auVar80);
                      uVar76 = *(undefined4 *)(lVar69 + 0x4c);
                      auVar170._4_4_ = uVar76;
                      auVar170._0_4_ = uVar76;
                      auVar170._8_4_ = uVar76;
                      auVar170._12_4_ = uVar76;
                      uVar76 = *(undefined4 *)(lVar69 + 0x40);
                      auVar183._4_4_ = uVar76;
                      auVar183._0_4_ = uVar76;
                      auVar183._8_4_ = uVar76;
                      auVar183._12_4_ = uVar76;
                      local_2b00._0_16_ = vfmadd213ps_fma(auVar80,auVar170,auVar183);
                      fVar79 = *(float *)(local_2b00 + uVar67);
                      auVar163._4_4_ = fVar79;
                      auVar163._0_4_ = fVar79;
                      auVar163._8_4_ = fVar79;
                      auVar163._12_4_ = fVar79;
                      auVar163._16_4_ = fVar79;
                      auVar163._20_4_ = fVar79;
                      auVar163._24_4_ = fVar79;
                      auVar163._28_4_ = fVar79;
                      auVar95 = vfmadd213ps_fma(auVar139,auVar58,auVar151);
                      auVar143._8_8_ = 0;
                      auVar143._0_8_ = *(ulong *)(lVar69 + 0x60);
                      auVar80 = vpmovzxbd_avx(auVar143);
                      auVar80 = vcvtdq2ps_avx(auVar80);
                      uVar76 = *(undefined4 *)(lVar69 + 0x7c);
                      auVar191._4_4_ = uVar76;
                      auVar191._0_4_ = uVar76;
                      auVar191._8_4_ = uVar76;
                      auVar191._12_4_ = uVar76;
                      uVar76 = *(undefined4 *)(lVar69 + 0x70);
                      auVar202._4_4_ = uVar76;
                      auVar202._0_4_ = uVar76;
                      auVar202._8_4_ = uVar76;
                      auVar202._12_4_ = uVar76;
                      auVar80 = vfmadd213ps_fma(auVar80,auVar191,auVar202);
                      local_29a0[0] = (RTCHitN)auVar80[0];
                      local_29a0[1] = (RTCHitN)auVar80[1];
                      local_29a0[2] = (RTCHitN)auVar80[2];
                      local_29a0[3] = (RTCHitN)auVar80[3];
                      local_29a0[4] = (RTCHitN)auVar80[4];
                      local_29a0[5] = (RTCHitN)auVar80[5];
                      local_29a0[6] = (RTCHitN)auVar80[6];
                      local_29a0[7] = (RTCHitN)auVar80[7];
                      local_29a0[8] = (RTCHitN)auVar80[8];
                      local_29a0[9] = (RTCHitN)auVar80[9];
                      local_29a0[10] = (RTCHitN)auVar80[10];
                      local_29a0[0xb] = (RTCHitN)auVar80[0xb];
                      local_29a0[0xc] = (RTCHitN)auVar80[0xc];
                      local_29a0[0xd] = (RTCHitN)auVar80[0xd];
                      local_29a0[0xe] = (RTCHitN)auVar80[0xe];
                      local_29a0[0xf] = (RTCHitN)auVar80[0xf];
                      fVar79 = *(float *)(local_29a0 + uVar67) - fVar79;
                      auVar152._4_4_ = fVar79;
                      auVar152._0_4_ = fVar79;
                      auVar152._8_4_ = fVar79;
                      auVar152._12_4_ = fVar79;
                      auVar152._16_4_ = fVar79;
                      auVar152._20_4_ = fVar79;
                      auVar152._24_4_ = fVar79;
                      auVar152._28_4_ = fVar79;
                      auVar96 = vfmadd213ps_fma(auVar152,auVar58,auVar163);
                      auVar160._8_8_ = 0;
                      auVar160._0_8_ = *(ulong *)(lVar69 + 0x34);
                      auVar80 = vpmovzxbd_avx(auVar160);
                      auVar80 = vcvtdq2ps_avx(auVar80);
                      local_2b00._0_16_ = vfmadd213ps_fma(auVar80,auVar170,auVar183);
                      fVar79 = *(float *)(local_2b00 + uVar67);
                      auVar164._4_4_ = fVar79;
                      auVar164._0_4_ = fVar79;
                      auVar164._8_4_ = fVar79;
                      auVar164._12_4_ = fVar79;
                      auVar164._16_4_ = fVar79;
                      auVar164._20_4_ = fVar79;
                      auVar164._24_4_ = fVar79;
                      auVar164._28_4_ = fVar79;
                      auVar171._8_8_ = 0;
                      auVar171._0_8_ = *(ulong *)(lVar69 + 100);
                      auVar80 = vpmovzxbd_avx(auVar171);
                      auVar80 = vcvtdq2ps_avx(auVar80);
                      auVar80 = vfmadd213ps_fma(auVar80,auVar191,auVar202);
                      local_29a0[0] = (RTCHitN)auVar80[0];
                      local_29a0[1] = (RTCHitN)auVar80[1];
                      local_29a0[2] = (RTCHitN)auVar80[2];
                      local_29a0[3] = (RTCHitN)auVar80[3];
                      local_29a0[4] = (RTCHitN)auVar80[4];
                      local_29a0[5] = (RTCHitN)auVar80[5];
                      local_29a0[6] = (RTCHitN)auVar80[6];
                      local_29a0[7] = (RTCHitN)auVar80[7];
                      local_29a0[8] = (RTCHitN)auVar80[8];
                      local_29a0[9] = (RTCHitN)auVar80[9];
                      local_29a0[10] = (RTCHitN)auVar80[10];
                      local_29a0[0xb] = (RTCHitN)auVar80[0xb];
                      local_29a0[0xc] = (RTCHitN)auVar80[0xc];
                      local_29a0[0xd] = (RTCHitN)auVar80[0xd];
                      local_29a0[0xe] = (RTCHitN)auVar80[0xe];
                      local_29a0[0xf] = (RTCHitN)auVar80[0xf];
                      fVar79 = *(float *)(local_29a0 + uVar67) - fVar79;
                      auVar176._4_4_ = fVar79;
                      auVar176._0_4_ = fVar79;
                      auVar176._8_4_ = fVar79;
                      auVar176._12_4_ = fVar79;
                      auVar176._16_4_ = fVar79;
                      auVar176._20_4_ = fVar79;
                      auVar176._24_4_ = fVar79;
                      auVar176._28_4_ = fVar79;
                      auVar80 = vfmadd213ps_fma(auVar176,auVar58,auVar164);
                      auVar53._8_8_ = local_2cc0._8_8_;
                      auVar53._0_8_ = local_2cc0._0_8_;
                      auVar53._16_8_ = local_2cc0._16_8_;
                      auVar53._24_8_ = local_2cc0._24_8_;
                      auVar55._8_8_ = local_2cc0._40_8_;
                      auVar55._0_8_ = local_2cc0._32_8_;
                      auVar55._16_8_ = local_2cc0._48_8_;
                      auVar55._24_8_ = local_2cc0._56_8_;
                      auVar57._8_8_ = local_2cc0._72_8_;
                      auVar57._0_8_ = local_2cc0._64_8_;
                      auVar57._16_8_ = local_2cc0._80_8_;
                      auVar57._24_8_ = local_2cc0._88_8_;
                      auVar134 = vsubps_avx(ZEXT1632(auVar94),auVar53);
                      auVar26._4_4_ = local_2c00._4_4_ * auVar134._4_4_;
                      auVar26._0_4_ = local_2c00._0_4_ * auVar134._0_4_;
                      auVar26._8_4_ = local_2c00._8_4_ * auVar134._8_4_;
                      auVar26._12_4_ = local_2c00._12_4_ * auVar134._12_4_;
                      auVar26._16_4_ = local_2c00._16_4_ * auVar134._16_4_;
                      auVar26._20_4_ = local_2c00._20_4_ * auVar134._20_4_;
                      auVar26._24_4_ = local_2c00._24_4_ * auVar134._24_4_;
                      auVar26._28_4_ = auVar134._28_4_;
                      auVar134 = vsubps_avx(ZEXT1632(auVar82),auVar55);
                      auVar27._4_4_ = (float)local_2be0._4_4_ * auVar134._4_4_;
                      auVar27._0_4_ = (float)local_2be0._0_4_ * auVar134._0_4_;
                      auVar27._8_4_ = fStack_2bd8 * auVar134._8_4_;
                      auVar27._12_4_ = fStack_2bd4 * auVar134._12_4_;
                      auVar27._16_4_ = fStack_2bd0 * auVar134._16_4_;
                      auVar27._20_4_ = fStack_2bcc * auVar134._20_4_;
                      auVar27._24_4_ = fStack_2bc8 * auVar134._24_4_;
                      auVar27._28_4_ = auVar134._28_4_;
                      auVar134 = vsubps_avx(ZEXT1632(auVar96),auVar57);
                      auVar28._4_4_ = (float)local_2bc0._4_4_ * auVar134._4_4_;
                      auVar28._0_4_ = (float)local_2bc0._0_4_ * auVar134._0_4_;
                      auVar28._8_4_ = fStack_2bb8 * auVar134._8_4_;
                      auVar28._12_4_ = fStack_2bb4 * auVar134._12_4_;
                      auVar28._16_4_ = fStack_2bb0 * auVar134._16_4_;
                      auVar28._20_4_ = fStack_2bac * auVar134._20_4_;
                      auVar28._24_4_ = fStack_2ba8 * auVar134._24_4_;
                      auVar28._28_4_ = auVar134._28_4_;
                      auVar134 = vsubps_avx(ZEXT1632(auVar81),auVar53);
                      auVar29._4_4_ = local_2c00._4_4_ * auVar134._4_4_;
                      auVar29._0_4_ = local_2c00._0_4_ * auVar134._0_4_;
                      auVar29._8_4_ = local_2c00._8_4_ * auVar134._8_4_;
                      auVar29._12_4_ = local_2c00._12_4_ * auVar134._12_4_;
                      auVar29._16_4_ = local_2c00._16_4_ * auVar134._16_4_;
                      auVar29._20_4_ = local_2c00._20_4_ * auVar134._20_4_;
                      auVar29._24_4_ = local_2c00._24_4_ * auVar134._24_4_;
                      auVar29._28_4_ = auVar134._28_4_;
                      auVar134 = vsubps_avx(ZEXT1632(auVar95),auVar55);
                      auVar30._4_4_ = (float)local_2be0._4_4_ * auVar134._4_4_;
                      auVar30._0_4_ = (float)local_2be0._0_4_ * auVar134._0_4_;
                      auVar30._8_4_ = fStack_2bd8 * auVar134._8_4_;
                      auVar30._12_4_ = fStack_2bd4 * auVar134._12_4_;
                      auVar30._16_4_ = fStack_2bd0 * auVar134._16_4_;
                      auVar30._20_4_ = fStack_2bcc * auVar134._20_4_;
                      auVar30._24_4_ = fStack_2bc8 * auVar134._24_4_;
                      auVar30._28_4_ = auVar134._28_4_;
                      auVar134 = vsubps_avx(ZEXT1632(auVar80),auVar57);
                      auVar31._4_4_ = (float)local_2bc0._4_4_ * auVar134._4_4_;
                      auVar31._0_4_ = (float)local_2bc0._0_4_ * auVar134._0_4_;
                      auVar31._8_4_ = fStack_2bb8 * auVar134._8_4_;
                      auVar31._12_4_ = fStack_2bb4 * auVar134._12_4_;
                      auVar31._16_4_ = fStack_2bb0 * auVar134._16_4_;
                      auVar31._20_4_ = fStack_2bac * auVar134._20_4_;
                      auVar31._24_4_ = fStack_2ba8 * auVar134._24_4_;
                      auVar31._28_4_ = auVar134._28_4_;
                      auVar134 = vminps_avx(auVar26,auVar29);
                      auVar114 = vminps_avx(auVar27,auVar30);
                      auVar134 = vmaxps_avx(auVar134,auVar114);
                      auVar114 = vminps_avx(auVar28,auVar31);
                      auVar134 = vmaxps_avx(auVar134,auVar114);
                      auVar32._4_4_ = auVar134._4_4_ * 0.99999964;
                      auVar32._0_4_ = auVar134._0_4_ * 0.99999964;
                      auVar32._8_4_ = auVar134._8_4_ * 0.99999964;
                      auVar32._12_4_ = auVar134._12_4_ * 0.99999964;
                      auVar32._16_4_ = auVar134._16_4_ * 0.99999964;
                      auVar32._20_4_ = auVar134._20_4_ * 0.99999964;
                      auVar32._24_4_ = auVar134._24_4_ * 0.99999964;
                      auVar32._28_4_ = auVar134._28_4_;
                      auVar134 = vmaxps_avx(auVar26,auVar29);
                      auVar114 = vmaxps_avx(auVar27,auVar30);
                      auVar114 = vminps_avx(auVar134,auVar114);
                      auVar134 = vmaxps_avx(auVar28,auVar31);
                      auVar134 = vminps_avx(auVar114,auVar134);
                      auVar33._4_4_ = auVar134._4_4_ * 1.0000004;
                      auVar33._0_4_ = auVar134._0_4_ * 1.0000004;
                      auVar33._8_4_ = auVar134._8_4_ * 1.0000004;
                      auVar33._12_4_ = auVar134._12_4_ * 1.0000004;
                      auVar33._16_4_ = auVar134._16_4_ * 1.0000004;
                      auVar33._20_4_ = auVar134._20_4_ * 1.0000004;
                      auVar33._24_4_ = auVar134._24_4_ * 1.0000004;
                      auVar33._28_4_ = auVar134._28_4_;
                      auVar134 = vmaxps_avx(auVar32,local_2b40);
                      auVar114 = vminps_avx(auVar33,local_2b20);
                      auVar134 = vcmpps_avx(auVar134,auVar114,2);
                      auVar134 = local_2d40 & auVar134;
                      local_2e50 = uVar68;
                      if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar134 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar134 >> 0x7f,0) == '\0') &&
                            (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar134 >> 0xbf,0) == '\0') &&
                          (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar134[0x1f]) {
                        bVar78 = false;
                        auVar134 = local_2d40;
                      }
                      else {
                        uVar2 = *(ushort *)(lVar69 + lVar63 * 8);
                        uVar3 = *(ushort *)(lVar69 + 2 + lVar63 * 8);
                        local_2800 = *(uint *)(lVar69 + 0x88);
                        local_2e20 = (ulong)local_2800;
                        local_2820 = *(uint *)(lVar69 + 4 + lVar63 * 8);
                        local_2e28 = (ulong)local_2820;
                        local_2ce0 = local_2d40;
                        uVar76 = vmovmskps_avx(local_2d40);
                        uVar68 = CONCAT44((int)(uVar62 >> 0x20),uVar76);
                        local_2f10 = uVar2 & 0x7fff;
                        local_2f0c = (uint)uVar3;
                        local_2f14 = local_2f0c & 0x7fff;
                        local_2e30 = (ulong)(-1 < (short)uVar2);
                        auVar88._0_8_ = (ulong)CONCAT24(uVar2,(uint)uVar2) & 0x7fff00007fff;
                        auVar88._8_4_ = local_2f10;
                        auVar88._12_4_ = local_2f10;
                        auVar88._16_4_ = local_2f10;
                        auVar88._20_4_ = local_2f10;
                        auVar88._24_4_ = local_2f10;
                        auVar88._28_4_ = local_2f10;
                        auVar134 = vpaddd_avx2(auVar88,_DAT_01fb7740);
                        auVar101._0_8_ = (ulong)CONCAT24(uVar3,local_2f0c) & 0x7fff00007fff;
                        auVar101._8_4_ = local_2f14;
                        auVar101._12_4_ = local_2f14;
                        auVar101._16_4_ = local_2f14;
                        auVar101._20_4_ = local_2f14;
                        auVar101._24_4_ = local_2f14;
                        auVar101._28_4_ = local_2f14;
                        auVar114 = vpaddd_avx2(auVar101,_DAT_01fb7760);
                        _local_2840 = vcvtdq2ps_avx(auVar134);
                        _local_2860 = vcvtdq2ps_avx(auVar114);
                        uStack_27fc = local_2800;
                        uStack_27f8 = local_2800;
                        uStack_27f4 = local_2800;
                        uStack_27f0 = local_2800;
                        uStack_27ec = local_2800;
                        uStack_27e8 = local_2800;
                        uStack_27e4 = local_2800;
                        uStack_281c = local_2820;
                        uStack_2818 = local_2820;
                        uStack_2814 = local_2820;
                        uStack_2810 = local_2820;
                        uStack_280c = local_2820;
                        uStack_2808 = local_2820;
                        uStack_2804 = local_2820;
                        uVar62 = uVar68;
                        unaff_R14 = local_2e20;
                        auVar134 = local_2dc0;
                        while (local_2dc0 = auVar134, pRVar60 = local_2e40, pRVar59 = local_2e48,
                              uVar68 != 0) {
                          uVar62 = 0;
                          for (uVar66 = uVar68; (uVar66 & 1) == 0;
                              uVar66 = uVar66 >> 1 | 0x8000000000000000) {
                            uVar62 = uVar62 + 1;
                          }
                          local_2da0._0_8_ = uVar62;
                          local_2e08 = context->scene;
                          pGVar4 = (local_2e08->geometries).items[unaff_R14].ptr;
                          local_2e10 = *(long *)&pGVar4->field_0x58;
                          local_2e18 = pGVar4[1].super_RefCount.refCounter.
                                       super___atomic_base<unsigned_long>._M_i * local_2e28;
                          BVar1 = pGVar4->time_range;
                          auVar83._8_8_ = 0;
                          auVar83._0_4_ = BVar1.lower;
                          auVar83._4_4_ = BVar1.upper;
                          fVar79 = BVar1.lower;
                          auVar102._4_4_ = fVar79;
                          auVar102._0_4_ = fVar79;
                          auVar102._8_4_ = fVar79;
                          auVar102._12_4_ = fVar79;
                          auVar102._16_4_ = fVar79;
                          auVar102._20_4_ = fVar79;
                          auVar102._24_4_ = fVar79;
                          auVar102._28_4_ = fVar79;
                          fVar79 = pGVar4->fnumTimeSegments;
                          auVar134 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar102);
                          auVar80 = vmovshdup_avx(auVar83);
                          auVar80 = vsubps_avx(auVar80,auVar83);
                          auVar89._0_4_ = auVar80._0_4_;
                          auVar89._4_4_ = auVar89._0_4_;
                          auVar89._8_4_ = auVar89._0_4_;
                          auVar89._12_4_ = auVar89._0_4_;
                          auVar89._16_4_ = auVar89._0_4_;
                          auVar89._20_4_ = auVar89._0_4_;
                          auVar89._24_4_ = auVar89._0_4_;
                          auVar89._28_4_ = auVar89._0_4_;
                          auVar134 = vdivps_avx(auVar134,auVar89);
                          auVar34._4_4_ = fVar79 * auVar134._4_4_;
                          auVar34._0_4_ = fVar79 * auVar134._0_4_;
                          auVar34._8_4_ = fVar79 * auVar134._8_4_;
                          auVar34._12_4_ = fVar79 * auVar134._12_4_;
                          auVar34._16_4_ = fVar79 * auVar134._16_4_;
                          auVar34._20_4_ = fVar79 * auVar134._20_4_;
                          auVar34._24_4_ = fVar79 * auVar134._24_4_;
                          auVar34._28_4_ = auVar134._28_4_;
                          auVar134 = vroundps_avx(auVar34,1);
                          fVar79 = fVar79 + -1.0;
                          auVar119._4_4_ = fVar79;
                          auVar119._0_4_ = fVar79;
                          auVar119._8_4_ = fVar79;
                          auVar119._12_4_ = fVar79;
                          auVar119._16_4_ = fVar79;
                          auVar119._20_4_ = fVar79;
                          auVar119._24_4_ = fVar79;
                          auVar119._28_4_ = fVar79;
                          auVar134 = vminps_avx(auVar134,auVar119);
                          auVar134 = vmaxps_avx(auVar134,_DAT_01f7b000);
                          local_2640 = vsubps_avx(auVar34,auVar134);
                          local_2660 = vcvtps2dq_avx(auVar134);
                          uVar64 = (ulong)((uint)uVar62 * 4);
                          uVar67 = *(uint *)(local_2e10 + 4 + local_2e18);
                          uVar72 = (ulong)uVar67;
                          uVar71 = (ulong)(uVar67 * local_2f14 +
                                          *(int *)(local_2e10 + local_2e18) + local_2f10);
                          lVar5 = *(long *)&pGVar4[2].numPrimitives;
                          lVar70 = (long)*(int *)(local_2660 + uVar64) * 0x38;
                          lVar6 = *(long *)(lVar5 + lVar70);
                          lVar7 = *(long *)(lVar5 + 0x10 + lVar70);
                          auVar80 = *(undefined1 (*) [16])(lVar6 + lVar7 * uVar71);
                          lVar8 = *(long *)(lVar5 + 0x48 + lVar70);
                          auVar94 = *(undefined1 (*) [16])(lVar6 + (uVar71 + 1) * lVar7);
                          lVar69 = uVar71 + uVar72;
                          auVar81 = *(undefined1 (*) [16])(lVar6 + lVar69 * lVar7);
                          lVar77 = uVar71 + uVar72 + 1;
                          auVar95 = *(undefined1 (*) [16])(lVar6 + lVar77 * lVar7);
                          lVar65 = uVar71 + local_2e30 + 1;
                          auVar82 = *(undefined1 (*) [16])(lVar6 + lVar65 * lVar7);
                          uVar68 = uVar68 - 1 & uVar68;
                          lVar63 = lVar77 + local_2e30;
                          uVar66 = 0;
                          if (-1 < (short)local_2f0c) {
                            uVar66 = uVar72;
                          }
                          auVar141 = *(undefined1 (*) [16])(lVar6 + lVar63 * lVar7);
                          auVar96 = *(undefined1 (*) [16])(lVar6 + (lVar69 + uVar66) * lVar7);
                          auVar112 = *(undefined1 (*) [16])(lVar6 + (lVar77 + uVar66) * lVar7);
                          auVar113 = *(undefined1 (*) [16])(lVar6 + lVar7 * (uVar66 + lVar63));
                          lVar5 = *(long *)(lVar5 + 0x38 + lVar70);
                          uVar76 = *(undefined4 *)(local_2640 + uVar64);
                          auVar223._4_4_ = uVar76;
                          auVar223._0_4_ = uVar76;
                          auVar223._8_4_ = uVar76;
                          auVar223._12_4_ = uVar76;
                          auVar128 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * uVar71),
                                                auVar80);
                          auVar128 = vfmadd213ps_fma(auVar128,auVar223,auVar80);
                          auVar80 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * (uVar71 + 1)),
                                               auVar94);
                          auVar129 = vfmadd213ps_fma(auVar80,auVar223,auVar94);
                          auVar80 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * lVar69),
                                               auVar81);
                          auVar130 = vfmadd213ps_fma(auVar80,auVar223,auVar81);
                          auVar80 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * lVar77),
                                               auVar95);
                          auVar131 = vfmadd213ps_fma(auVar80,auVar223,auVar95);
                          auVar80 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * lVar65),
                                               auVar82);
                          auVar94 = vfmadd213ps_fma(auVar80,auVar223,auVar82);
                          auVar80 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * lVar63),
                                               auVar141);
                          auVar141 = vfmadd213ps_fma(auVar80,auVar223,auVar141);
                          auVar80 = vsubps_avx(*(undefined1 (*) [16])
                                                (lVar5 + lVar8 * (lVar69 + uVar66)),auVar96);
                          auVar142 = vfmadd213ps_fma(auVar80,auVar223,auVar96);
                          auVar80 = vsubps_avx(*(undefined1 (*) [16])
                                                (lVar5 + lVar8 * (lVar77 + uVar66)),auVar112);
                          auVar143 = vfmadd213ps_fma(auVar80,auVar223,auVar112);
                          auVar80 = vsubps_avx(*(undefined1 (*) [16])
                                                (lVar5 + (uVar66 + lVar63) * lVar8),auVar113);
                          auVar157 = vfmadd213ps_fma(auVar80,auVar223,auVar113);
                          auVar81 = vunpcklps_avx(auVar129,auVar141);
                          auVar80 = vunpckhps_avx(auVar129,auVar141);
                          auVar82 = vunpcklps_avx(auVar94,auVar131);
                          auVar94 = vunpckhps_avx(auVar94,auVar131);
                          auVar95 = vunpcklps_avx(auVar80,auVar94);
                          auVar96 = vunpcklps_avx(auVar81,auVar82);
                          auVar80 = vunpckhps_avx(auVar81,auVar82);
                          auVar82 = vunpcklps_avx(auVar130,auVar143);
                          auVar94 = vunpckhps_avx(auVar130,auVar143);
                          auVar112 = vunpcklps_avx(auVar131,auVar142);
                          auVar81 = vunpckhps_avx(auVar131,auVar142);
                          auVar81 = vunpcklps_avx(auVar94,auVar81);
                          auVar113 = vunpcklps_avx(auVar82,auVar112);
                          auVar94 = vunpckhps_avx(auVar82,auVar112);
                          auVar165._16_16_ = auVar143;
                          auVar165._0_16_ = auVar130;
                          auVar90._16_16_ = auVar141;
                          auVar90._0_16_ = auVar129;
                          auVar134 = vunpcklps_avx(auVar90,auVar165);
                          auVar186._16_16_ = auVar131;
                          auVar186._0_16_ = auVar128;
                          auVar103._16_16_ = auVar157;
                          auVar103._0_16_ = auVar131;
                          auVar114 = vunpcklps_avx(auVar186,auVar103);
                          auVar132 = vunpcklps_avx(auVar114,auVar134);
                          auVar134 = vunpckhps_avx(auVar114,auVar134);
                          auVar114 = vunpckhps_avx(auVar90,auVar165);
                          auVar99 = vunpckhps_avx(auVar186,auVar103);
                          auVar114 = vunpcklps_avx(auVar99,auVar114);
                          auVar166._16_16_ = auVar96;
                          auVar166._0_16_ = auVar96;
                          auVar215._16_16_ = auVar80;
                          auVar215._0_16_ = auVar80;
                          auVar177._16_16_ = auVar95;
                          auVar177._0_16_ = auVar95;
                          auVar224._16_16_ = auVar113;
                          auVar224._0_16_ = auVar113;
                          auVar213._16_16_ = auVar94;
                          auVar213._0_16_ = auVar94;
                          uVar76 = *(undefined4 *)(local_2e48 + uVar64);
                          auVar193._4_4_ = uVar76;
                          auVar193._0_4_ = uVar76;
                          auVar193._8_4_ = uVar76;
                          auVar193._12_4_ = uVar76;
                          auVar193._16_4_ = uVar76;
                          auVar193._20_4_ = uVar76;
                          auVar193._24_4_ = uVar76;
                          auVar193._28_4_ = uVar76;
                          uVar76 = *(undefined4 *)(local_2e48 + uVar64 + 0x20);
                          auVar205._4_4_ = uVar76;
                          auVar205._0_4_ = uVar76;
                          auVar205._8_4_ = uVar76;
                          auVar205._12_4_ = uVar76;
                          auVar205._16_4_ = uVar76;
                          auVar205._20_4_ = uVar76;
                          auVar205._24_4_ = uVar76;
                          auVar205._28_4_ = uVar76;
                          uVar76 = *(undefined4 *)(local_2e48 + uVar64 + 0x40);
                          auVar212._4_4_ = uVar76;
                          auVar212._0_4_ = uVar76;
                          auVar212._8_4_ = uVar76;
                          auVar212._12_4_ = uVar76;
                          auVar212._16_4_ = uVar76;
                          auVar212._20_4_ = uVar76;
                          auVar212._24_4_ = uVar76;
                          auVar212._28_4_ = uVar76;
                          auVar120._16_16_ = auVar81;
                          auVar120._0_16_ = auVar81;
                          local_2ea0 = vsubps_avx(auVar132,auVar193);
                          local_2680 = vsubps_avx(auVar134,auVar205);
                          local_26a0 = vsubps_avx(auVar114,auVar212);
                          auVar114 = vsubps_avx(auVar166,auVar193);
                          auVar99 = vsubps_avx(auVar215,auVar205);
                          auVar134 = vsubps_avx(auVar177,auVar212);
                          auVar132 = vsubps_avx(auVar224,auVar193);
                          auVar133 = vsubps_avx(auVar213,auVar205);
                          auVar144 = vsubps_avx(auVar120,auVar212);
                          local_26c0 = vsubps_avx(auVar132,local_2ea0);
                          local_2700 = vsubps_avx(auVar133,local_2680);
                          local_26e0 = vsubps_avx(auVar144,local_26a0);
                          auVar91._0_4_ = auVar132._0_4_ + local_2ea0._0_4_;
                          auVar91._4_4_ = auVar132._4_4_ + local_2ea0._4_4_;
                          auVar91._8_4_ = auVar132._8_4_ + local_2ea0._8_4_;
                          auVar91._12_4_ = auVar132._12_4_ + local_2ea0._12_4_;
                          auVar91._16_4_ = auVar132._16_4_ + local_2ea0._16_4_;
                          auVar91._20_4_ = auVar132._20_4_ + local_2ea0._20_4_;
                          auVar91._24_4_ = auVar132._24_4_ + local_2ea0._24_4_;
                          auVar91._28_4_ = auVar132._28_4_ + local_2ea0._28_4_;
                          auVar121._0_4_ = local_2680._0_4_ + auVar133._0_4_;
                          auVar121._4_4_ = local_2680._4_4_ + auVar133._4_4_;
                          auVar121._8_4_ = local_2680._8_4_ + auVar133._8_4_;
                          auVar121._12_4_ = local_2680._12_4_ + auVar133._12_4_;
                          auVar121._16_4_ = local_2680._16_4_ + auVar133._16_4_;
                          auVar121._20_4_ = local_2680._20_4_ + auVar133._20_4_;
                          auVar121._24_4_ = local_2680._24_4_ + auVar133._24_4_;
                          auVar121._28_4_ = local_2680._28_4_ + auVar133._28_4_;
                          fVar79 = local_26a0._0_4_;
                          auVar178._0_4_ = auVar144._0_4_ + fVar79;
                          fVar10 = local_26a0._4_4_;
                          auVar178._4_4_ = auVar144._4_4_ + fVar10;
                          fVar11 = local_26a0._8_4_;
                          auVar178._8_4_ = auVar144._8_4_ + fVar11;
                          fVar12 = local_26a0._12_4_;
                          auVar178._12_4_ = auVar144._12_4_ + fVar12;
                          fVar13 = local_26a0._16_4_;
                          auVar178._16_4_ = auVar144._16_4_ + fVar13;
                          fVar14 = local_26a0._20_4_;
                          auVar178._20_4_ = auVar144._20_4_ + fVar14;
                          fVar15 = local_26a0._24_4_;
                          auVar178._24_4_ = auVar144._24_4_ + fVar15;
                          auVar178._28_4_ = auVar144._28_4_ + local_26a0._28_4_;
                          auVar35._4_4_ = local_26e0._4_4_ * auVar121._4_4_;
                          auVar35._0_4_ = local_26e0._0_4_ * auVar121._0_4_;
                          auVar35._8_4_ = local_26e0._8_4_ * auVar121._8_4_;
                          auVar35._12_4_ = local_26e0._12_4_ * auVar121._12_4_;
                          auVar35._16_4_ = local_26e0._16_4_ * auVar121._16_4_;
                          auVar35._20_4_ = local_26e0._20_4_ * auVar121._20_4_;
                          auVar35._24_4_ = local_26e0._24_4_ * auVar121._24_4_;
                          auVar35._28_4_ = auVar80._12_4_;
                          auVar94 = vfmsub231ps_fma(auVar35,local_2700,auVar178);
                          auVar36._4_4_ = local_26c0._4_4_ * auVar178._4_4_;
                          auVar36._0_4_ = local_26c0._0_4_ * auVar178._0_4_;
                          auVar36._8_4_ = local_26c0._8_4_ * auVar178._8_4_;
                          auVar36._12_4_ = local_26c0._12_4_ * auVar178._12_4_;
                          auVar36._16_4_ = local_26c0._16_4_ * auVar178._16_4_;
                          auVar36._20_4_ = local_26c0._20_4_ * auVar178._20_4_;
                          auVar36._24_4_ = local_26c0._24_4_ * auVar178._24_4_;
                          auVar36._28_4_ = auVar178._28_4_;
                          auVar80 = vfmsub231ps_fma(auVar36,local_26e0,auVar91);
                          auVar37._4_4_ = local_2700._4_4_ * auVar91._4_4_;
                          auVar37._0_4_ = local_2700._0_4_ * auVar91._0_4_;
                          auVar37._8_4_ = local_2700._8_4_ * auVar91._8_4_;
                          auVar37._12_4_ = local_2700._12_4_ * auVar91._12_4_;
                          auVar37._16_4_ = local_2700._16_4_ * auVar91._16_4_;
                          auVar37._20_4_ = local_2700._20_4_ * auVar91._20_4_;
                          auVar37._24_4_ = local_2700._24_4_ * auVar91._24_4_;
                          auVar37._28_4_ = auVar91._28_4_;
                          auVar81 = vfmsub231ps_fma(auVar37,local_26c0,auVar121);
                          local_2ec0._4_4_ = *(undefined4 *)(local_2e48 + uVar64 + 0xc0);
                          auVar38._4_4_ = (float)local_2ec0._4_4_ * auVar81._4_4_;
                          auVar38._0_4_ = (float)local_2ec0._4_4_ * auVar81._0_4_;
                          auVar38._8_4_ = (float)local_2ec0._4_4_ * auVar81._8_4_;
                          auVar38._12_4_ = (float)local_2ec0._4_4_ * auVar81._12_4_;
                          auVar38._16_4_ = (float)local_2ec0._4_4_ * 0.0;
                          auVar38._20_4_ = (float)local_2ec0._4_4_ * 0.0;
                          auVar38._24_4_ = (float)local_2ec0._4_4_ * 0.0;
                          auVar38._28_4_ = auVar121._28_4_;
                          uVar76 = *(undefined4 *)(local_2e48 + uVar64 + 0xa0);
                          local_2f00._4_4_ = uVar76;
                          local_2f00._0_4_ = uVar76;
                          local_2f00._8_4_ = uVar76;
                          local_2f00._12_4_ = uVar76;
                          local_2f00._16_4_ = uVar76;
                          local_2f00._20_4_ = uVar76;
                          local_2f00._24_4_ = uVar76;
                          local_2f00._28_4_ = uVar76;
                          auVar80 = vfmadd231ps_fma(auVar38,local_2f00,ZEXT1632(auVar80));
                          uVar76 = *(undefined4 *)(local_2e48 + uVar64 + 0x80);
                          local_2ee0._4_4_ = uVar76;
                          local_2ee0._0_4_ = uVar76;
                          local_2ee0._8_4_ = uVar76;
                          local_2ee0._12_4_ = uVar76;
                          local_2ee0._16_4_ = uVar76;
                          local_2ee0._20_4_ = uVar76;
                          local_2ee0._24_4_ = uVar76;
                          local_2ee0._28_4_ = uVar76;
                          auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),local_2ee0,ZEXT1632(auVar94));
                          local_2720 = vsubps_avx(local_2680,auVar99);
                          in_ZMM13 = ZEXT3264(local_2720);
                          local_2740 = vsubps_avx(local_26a0,auVar134);
                          auVar153._0_4_ = local_2680._0_4_ + auVar99._0_4_;
                          auVar153._4_4_ = local_2680._4_4_ + auVar99._4_4_;
                          auVar153._8_4_ = local_2680._8_4_ + auVar99._8_4_;
                          auVar153._12_4_ = local_2680._12_4_ + auVar99._12_4_;
                          auVar153._16_4_ = local_2680._16_4_ + auVar99._16_4_;
                          auVar153._20_4_ = local_2680._20_4_ + auVar99._20_4_;
                          auVar153._24_4_ = local_2680._24_4_ + auVar99._24_4_;
                          auVar153._28_4_ = local_2680._28_4_ + auVar99._28_4_;
                          auVar179._0_4_ = auVar134._0_4_ + fVar79;
                          auVar179._4_4_ = auVar134._4_4_ + fVar10;
                          auVar179._8_4_ = auVar134._8_4_ + fVar11;
                          auVar179._12_4_ = auVar134._12_4_ + fVar12;
                          auVar179._16_4_ = auVar134._16_4_ + fVar13;
                          auVar179._20_4_ = auVar134._20_4_ + fVar14;
                          auVar179._24_4_ = auVar134._24_4_ + fVar15;
                          fVar190 = auVar134._28_4_;
                          auVar179._28_4_ = fVar190 + local_26a0._28_4_;
                          in_ZMM14 = ZEXT3264(auVar134);
                          fVar93 = local_2740._0_4_;
                          fVar107 = local_2740._4_4_;
                          auVar39._4_4_ = auVar153._4_4_ * fVar107;
                          auVar39._0_4_ = auVar153._0_4_ * fVar93;
                          fVar109 = local_2740._8_4_;
                          auVar39._8_4_ = auVar153._8_4_ * fVar109;
                          fVar111 = local_2740._12_4_;
                          auVar39._12_4_ = auVar153._12_4_ * fVar111;
                          fVar17 = local_2740._16_4_;
                          auVar39._16_4_ = auVar153._16_4_ * fVar17;
                          fVar19 = local_2740._20_4_;
                          auVar39._20_4_ = auVar153._20_4_ * fVar19;
                          fVar21 = local_2740._24_4_;
                          auVar39._24_4_ = auVar153._24_4_ * fVar21;
                          auVar39._28_4_ = fVar190;
                          auVar81 = vfmsub231ps_fma(auVar39,local_2720,auVar179);
                          local_2760 = vsubps_avx(local_2ea0,auVar114);
                          fVar106 = local_2760._0_4_;
                          fVar108 = local_2760._4_4_;
                          auVar40._4_4_ = auVar179._4_4_ * fVar108;
                          auVar40._0_4_ = auVar179._0_4_ * fVar106;
                          fVar110 = local_2760._8_4_;
                          auVar40._8_4_ = auVar179._8_4_ * fVar110;
                          fVar16 = local_2760._12_4_;
                          auVar40._12_4_ = auVar179._12_4_ * fVar16;
                          fVar18 = local_2760._16_4_;
                          auVar40._16_4_ = auVar179._16_4_ * fVar18;
                          fVar20 = local_2760._20_4_;
                          auVar40._20_4_ = auVar179._20_4_ * fVar20;
                          fVar22 = local_2760._24_4_;
                          auVar40._24_4_ = auVar179._24_4_ * fVar22;
                          auVar40._28_4_ = local_26e0._28_4_;
                          auVar180._0_4_ = auVar114._0_4_ + local_2ea0._0_4_;
                          auVar180._4_4_ = auVar114._4_4_ + local_2ea0._4_4_;
                          auVar180._8_4_ = auVar114._8_4_ + local_2ea0._8_4_;
                          auVar180._12_4_ = auVar114._12_4_ + local_2ea0._12_4_;
                          auVar180._16_4_ = auVar114._16_4_ + local_2ea0._16_4_;
                          auVar180._20_4_ = auVar114._20_4_ + local_2ea0._20_4_;
                          auVar180._24_4_ = auVar114._24_4_ + local_2ea0._24_4_;
                          auVar180._28_4_ = auVar114._28_4_ + local_2ea0._28_4_;
                          auVar94 = vfmsub231ps_fma(auVar40,local_2740,auVar180);
                          fVar214 = local_2720._0_4_;
                          fVar216 = local_2720._4_4_;
                          auVar41._4_4_ = fVar216 * auVar180._4_4_;
                          auVar41._0_4_ = fVar214 * auVar180._0_4_;
                          fVar217 = local_2720._8_4_;
                          auVar41._8_4_ = fVar217 * auVar180._8_4_;
                          fVar218 = local_2720._12_4_;
                          auVar41._12_4_ = fVar218 * auVar180._12_4_;
                          fVar219 = local_2720._16_4_;
                          auVar41._16_4_ = fVar219 * auVar180._16_4_;
                          fVar220 = local_2720._20_4_;
                          auVar41._20_4_ = fVar220 * auVar180._20_4_;
                          fVar221 = local_2720._24_4_;
                          auVar41._24_4_ = fVar221 * auVar180._24_4_;
                          auVar41._28_4_ = auVar180._28_4_;
                          auVar82 = vfmsub231ps_fma(auVar41,local_2760,auVar153);
                          auVar181._0_4_ = (float)local_2ec0._4_4_ * auVar82._0_4_;
                          auVar181._4_4_ = (float)local_2ec0._4_4_ * auVar82._4_4_;
                          auVar181._8_4_ = (float)local_2ec0._4_4_ * auVar82._8_4_;
                          auVar181._12_4_ = (float)local_2ec0._4_4_ * auVar82._12_4_;
                          auVar181._16_4_ = (float)local_2ec0._4_4_ * 0.0;
                          auVar181._20_4_ = (float)local_2ec0._4_4_ * 0.0;
                          auVar181._24_4_ = (float)local_2ec0._4_4_ * 0.0;
                          auVar181._28_4_ = 0;
                          auVar94 = vfmadd231ps_fma(auVar181,local_2f00,ZEXT1632(auVar94));
                          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),local_2ee0,ZEXT1632(auVar81));
                          auVar172 = vsubps_avx(auVar114,auVar132);
                          auVar154._0_4_ = auVar114._0_4_ + auVar132._0_4_;
                          auVar154._4_4_ = auVar114._4_4_ + auVar132._4_4_;
                          auVar154._8_4_ = auVar114._8_4_ + auVar132._8_4_;
                          auVar154._12_4_ = auVar114._12_4_ + auVar132._12_4_;
                          auVar154._16_4_ = auVar114._16_4_ + auVar132._16_4_;
                          auVar154._20_4_ = auVar114._20_4_ + auVar132._20_4_;
                          auVar154._24_4_ = auVar114._24_4_ + auVar132._24_4_;
                          auVar154._28_4_ = auVar114._28_4_ + auVar132._28_4_;
                          auVar132 = vsubps_avx(auVar99,auVar133);
                          auVar187._0_4_ = auVar99._0_4_ + auVar133._0_4_;
                          auVar187._4_4_ = auVar99._4_4_ + auVar133._4_4_;
                          auVar187._8_4_ = auVar99._8_4_ + auVar133._8_4_;
                          auVar187._12_4_ = auVar99._12_4_ + auVar133._12_4_;
                          auVar187._16_4_ = auVar99._16_4_ + auVar133._16_4_;
                          auVar187._20_4_ = auVar99._20_4_ + auVar133._20_4_;
                          auVar187._24_4_ = auVar99._24_4_ + auVar133._24_4_;
                          auVar187._28_4_ = auVar99._28_4_ + auVar133._28_4_;
                          auVar133 = vsubps_avx(auVar134,auVar144);
                          auVar140._0_4_ = auVar134._0_4_ + auVar144._0_4_;
                          auVar140._4_4_ = auVar134._4_4_ + auVar144._4_4_;
                          auVar140._8_4_ = auVar134._8_4_ + auVar144._8_4_;
                          auVar140._12_4_ = auVar134._12_4_ + auVar144._12_4_;
                          auVar140._16_4_ = auVar134._16_4_ + auVar144._16_4_;
                          auVar140._20_4_ = auVar134._20_4_ + auVar144._20_4_;
                          auVar140._24_4_ = auVar134._24_4_ + auVar144._24_4_;
                          auVar140._28_4_ = fVar190 + auVar144._28_4_;
                          auVar194._0_4_ = auVar187._0_4_ * auVar133._0_4_;
                          auVar194._4_4_ = auVar187._4_4_ * auVar133._4_4_;
                          auVar194._8_4_ = auVar187._8_4_ * auVar133._8_4_;
                          auVar194._12_4_ = auVar187._12_4_ * auVar133._12_4_;
                          auVar194._16_4_ = auVar187._16_4_ * auVar133._16_4_;
                          auVar194._20_4_ = auVar187._20_4_ * auVar133._20_4_;
                          auVar194._24_4_ = auVar187._24_4_ * auVar133._24_4_;
                          auVar194._28_4_ = 0;
                          auVar82 = vfmsub231ps_fma(auVar194,auVar132,auVar140);
                          auVar42._4_4_ = auVar140._4_4_ * auVar172._4_4_;
                          auVar42._0_4_ = auVar140._0_4_ * auVar172._0_4_;
                          auVar42._8_4_ = auVar140._8_4_ * auVar172._8_4_;
                          auVar42._12_4_ = auVar140._12_4_ * auVar172._12_4_;
                          auVar42._16_4_ = auVar140._16_4_ * auVar172._16_4_;
                          auVar42._20_4_ = auVar140._20_4_ * auVar172._20_4_;
                          auVar42._24_4_ = auVar140._24_4_ * auVar172._24_4_;
                          auVar42._28_4_ = auVar140._28_4_;
                          auVar81 = vfmsub231ps_fma(auVar42,auVar133,auVar154);
                          auVar43._4_4_ = auVar154._4_4_ * auVar132._4_4_;
                          auVar43._0_4_ = auVar154._0_4_ * auVar132._0_4_;
                          auVar43._8_4_ = auVar154._8_4_ * auVar132._8_4_;
                          auVar43._12_4_ = auVar154._12_4_ * auVar132._12_4_;
                          auVar43._16_4_ = auVar154._16_4_ * auVar132._16_4_;
                          auVar43._20_4_ = auVar154._20_4_ * auVar132._20_4_;
                          auVar43._24_4_ = auVar154._24_4_ * auVar132._24_4_;
                          auVar43._28_4_ = auVar154._28_4_;
                          auVar95 = vfmsub231ps_fma(auVar43,auVar172,auVar187);
                          local_2ec0._0_4_ = local_2ec0._4_4_;
                          fStack_2eb8 = (float)local_2ec0._4_4_;
                          fStack_2eb4 = (float)local_2ec0._4_4_;
                          fStack_2eb0 = (float)local_2ec0._4_4_;
                          fStack_2eac = (float)local_2ec0._4_4_;
                          fStack_2ea8 = (float)local_2ec0._4_4_;
                          fStack_2ea4 = (float)local_2ec0._4_4_;
                          auVar155._0_4_ = (float)local_2ec0._4_4_ * auVar95._0_4_;
                          auVar155._4_4_ = (float)local_2ec0._4_4_ * auVar95._4_4_;
                          auVar155._8_4_ = (float)local_2ec0._4_4_ * auVar95._8_4_;
                          auVar155._12_4_ = (float)local_2ec0._4_4_ * auVar95._12_4_;
                          auVar155._16_4_ = (float)local_2ec0._4_4_ * 0.0;
                          auVar155._20_4_ = (float)local_2ec0._4_4_ * 0.0;
                          auVar155._24_4_ = (float)local_2ec0._4_4_ * 0.0;
                          auVar155._28_4_ = 0;
                          auVar81 = vfmadd231ps_fma(auVar155,local_2f00,ZEXT1632(auVar81));
                          auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),local_2ee0,ZEXT1632(auVar82));
                          fVar201 = auVar81._0_4_ + auVar80._0_4_ + auVar94._0_4_;
                          fVar208 = auVar81._4_4_ + auVar80._4_4_ + auVar94._4_4_;
                          fVar209 = auVar81._8_4_ + auVar80._8_4_ + auVar94._8_4_;
                          fVar210 = auVar81._12_4_ + auVar80._12_4_ + auVar94._12_4_;
                          local_2dc0 = ZEXT1632(CONCAT412(fVar210,CONCAT48(fVar209,CONCAT44(fVar208,
                                                  fVar201))));
                          local_2de0 = ZEXT1632(auVar80);
                          auVar114 = vminps_avx(local_2de0,ZEXT1632(auVar94));
                          auVar114 = vminps_avx(auVar114,ZEXT1632(auVar81));
                          local_2780 = vandps_avx(local_2dc0,local_2d00);
                          fVar190 = local_2780._0_4_ * 1.1920929e-07;
                          fVar195 = local_2780._4_4_ * 1.1920929e-07;
                          auVar44._4_4_ = fVar195;
                          auVar44._0_4_ = fVar190;
                          fVar196 = local_2780._8_4_ * 1.1920929e-07;
                          auVar44._8_4_ = fVar196;
                          fVar197 = local_2780._12_4_ * 1.1920929e-07;
                          auVar44._12_4_ = fVar197;
                          fVar198 = local_2780._16_4_ * 1.1920929e-07;
                          auVar44._16_4_ = fVar198;
                          fVar199 = local_2780._20_4_ * 1.1920929e-07;
                          auVar44._20_4_ = fVar199;
                          fVar200 = local_2780._24_4_ * 1.1920929e-07;
                          auVar44._24_4_ = fVar200;
                          auVar44._28_4_ = 0x34000000;
                          auVar188._0_8_ = CONCAT44(fVar195,fVar190) ^ 0x8000000080000000;
                          auVar188._8_4_ = -fVar196;
                          auVar188._12_4_ = -fVar197;
                          auVar188._16_4_ = -fVar198;
                          auVar188._20_4_ = -fVar199;
                          auVar188._24_4_ = -fVar200;
                          auVar188._28_4_ = 0xb4000000;
                          auVar114 = vcmpps_avx(auVar114,auVar188,5);
                          auVar144 = ZEXT1632(auVar94);
                          auVar99 = vmaxps_avx(local_2de0,auVar144);
                          auVar99 = vmaxps_avx(auVar99,ZEXT1632(auVar81));
                          auVar99 = vcmpps_avx(auVar99,auVar44,2);
                          auVar114 = vorps_avx(auVar114,auVar99);
                          pauVar73 = local_2f38;
                          NVar74.ptr = local_2f30.ptr;
                          ray = pRVar59;
                          puVar75 = local_2e38;
                          unaff_R14 = local_2e20;
                          context = pRVar60;
                          if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar114 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar114 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar114 >> 0x7f,0) != '\0') ||
                                (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar114 >> 0xbf,0) != '\0') ||
                              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar114[0x1f] < '\0') {
                            in_ZMM13 = ZEXT3264(local_2720);
                            auVar45._4_4_ = fVar216 * local_26e0._4_4_;
                            auVar45._0_4_ = fVar214 * local_26e0._0_4_;
                            auVar45._8_4_ = fVar217 * local_26e0._8_4_;
                            auVar45._12_4_ = fVar218 * local_26e0._12_4_;
                            auVar45._16_4_ = fVar219 * local_26e0._16_4_;
                            auVar45._20_4_ = fVar220 * local_26e0._20_4_;
                            auVar45._24_4_ = fVar221 * local_26e0._24_4_;
                            auVar45._28_4_ = auVar99._28_4_;
                            in_ZMM14 = ZEXT3264(local_2760);
                            auVar122._0_4_ = fVar106 * local_2700._0_4_;
                            auVar122._4_4_ = fVar108 * local_2700._4_4_;
                            auVar122._8_4_ = fVar110 * local_2700._8_4_;
                            auVar122._12_4_ = fVar16 * local_2700._12_4_;
                            auVar122._16_4_ = fVar18 * local_2700._16_4_;
                            auVar122._20_4_ = fVar20 * local_2700._20_4_;
                            auVar122._24_4_ = fVar22 * local_2700._24_4_;
                            auVar122._28_4_ = 0;
                            auVar80 = vfmsub213ps_fma(local_2700,local_2740,auVar45);
                            auVar46._4_4_ = fVar107 * auVar132._4_4_;
                            auVar46._0_4_ = fVar93 * auVar132._0_4_;
                            auVar46._8_4_ = fVar109 * auVar132._8_4_;
                            auVar46._12_4_ = fVar111 * auVar132._12_4_;
                            auVar46._16_4_ = fVar17 * auVar132._16_4_;
                            auVar46._20_4_ = fVar19 * auVar132._20_4_;
                            auVar46._24_4_ = fVar21 * auVar132._24_4_;
                            auVar46._28_4_ = 0x34000000;
                            auVar47._4_4_ = fVar108 * auVar133._4_4_;
                            auVar47._0_4_ = fVar106 * auVar133._0_4_;
                            auVar47._8_4_ = fVar110 * auVar133._8_4_;
                            auVar47._12_4_ = fVar16 * auVar133._12_4_;
                            auVar47._16_4_ = fVar18 * auVar133._16_4_;
                            auVar47._20_4_ = fVar20 * auVar133._20_4_;
                            auVar47._24_4_ = fVar22 * auVar133._24_4_;
                            auVar47._28_4_ = local_2780._28_4_;
                            auVar94 = vfmsub213ps_fma(auVar133,local_2720,auVar46);
                            auVar134 = vandps_avx(local_2d00,auVar45);
                            auVar99 = vandps_avx(auVar46,local_2d00);
                            auVar134 = vcmpps_avx(auVar134,auVar99,1);
                            auVar133 = vblendvps_avx(ZEXT1632(auVar94),ZEXT1632(auVar80),auVar134);
                            auVar48._4_4_ = fVar216 * auVar172._4_4_;
                            auVar48._0_4_ = fVar214 * auVar172._0_4_;
                            auVar48._8_4_ = fVar217 * auVar172._8_4_;
                            auVar48._12_4_ = fVar218 * auVar172._12_4_;
                            auVar48._16_4_ = fVar219 * auVar172._16_4_;
                            auVar48._20_4_ = fVar220 * auVar172._20_4_;
                            auVar48._24_4_ = fVar221 * auVar172._24_4_;
                            auVar48._28_4_ = auVar134._28_4_;
                            auVar80 = vfmsub213ps_fma(auVar172,local_2740,auVar47);
                            auVar167._0_4_ = local_26c0._0_4_ * fVar93;
                            auVar167._4_4_ = local_26c0._4_4_ * fVar107;
                            auVar167._8_4_ = local_26c0._8_4_ * fVar109;
                            auVar167._12_4_ = local_26c0._12_4_ * fVar111;
                            auVar167._16_4_ = local_26c0._16_4_ * fVar17;
                            auVar167._20_4_ = local_26c0._20_4_ * fVar19;
                            auVar167._24_4_ = local_26c0._24_4_ * fVar21;
                            auVar167._28_4_ = 0;
                            auVar94 = vfmsub213ps_fma(local_26e0,local_2760,auVar167);
                            auVar134 = vandps_avx(local_2d00,auVar167);
                            auVar99 = vandps_avx(auVar47,local_2d00);
                            auVar134 = vcmpps_avx(auVar134,auVar99,1);
                            auVar172 = vblendvps_avx(ZEXT1632(auVar80),ZEXT1632(auVar94),auVar134);
                            auVar80 = vfmsub213ps_fma(local_26c0,local_2720,auVar122);
                            auVar94 = vfmsub213ps_fma(auVar132,local_2760,auVar48);
                            auVar134 = vandps_avx(local_2d00,auVar122);
                            auVar99 = vandps_avx(local_2d00,auVar48);
                            auVar134 = vcmpps_avx(auVar134,auVar99,1);
                            auVar134 = vblendvps_avx(ZEXT1632(auVar94),ZEXT1632(auVar80),auVar134);
                            auVar80 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
                            fVar93 = auVar134._0_4_;
                            fVar106 = auVar134._4_4_;
                            auVar49._4_4_ = fVar106 * (float)local_2ec0._4_4_;
                            auVar49._0_4_ = fVar93 * (float)local_2ec0._4_4_;
                            fVar107 = auVar134._8_4_;
                            auVar49._8_4_ = fVar107 * (float)local_2ec0._4_4_;
                            fVar108 = auVar134._12_4_;
                            auVar49._12_4_ = fVar108 * (float)local_2ec0._4_4_;
                            fVar109 = auVar134._16_4_;
                            auVar49._16_4_ = fVar109 * (float)local_2ec0._4_4_;
                            fVar110 = auVar134._20_4_;
                            auVar49._20_4_ = fVar110 * (float)local_2ec0._4_4_;
                            fVar111 = auVar134._24_4_;
                            auVar49._24_4_ = fVar111 * (float)local_2ec0._4_4_;
                            auVar49._28_4_ = auVar133._28_4_;
                            auVar94 = vfmadd213ps_fma(local_2f00,auVar172,auVar49);
                            auVar94 = vfmadd213ps_fma(local_2ee0,auVar133,ZEXT1632(auVar94));
                            auVar132 = ZEXT1632(CONCAT412(auVar94._12_4_ + auVar94._12_4_,
                                                          CONCAT48(auVar94._8_4_ + auVar94._8_4_,
                                                                   CONCAT44(auVar94._4_4_ +
                                                                            auVar94._4_4_,
                                                                            auVar94._0_4_ +
                                                                            auVar94._0_4_))));
                            auVar156._0_4_ = fVar93 * fVar79;
                            auVar156._4_4_ = fVar106 * fVar10;
                            auVar156._8_4_ = fVar107 * fVar11;
                            auVar156._12_4_ = fVar108 * fVar12;
                            auVar156._16_4_ = fVar109 * fVar13;
                            auVar156._20_4_ = fVar110 * fVar14;
                            auVar156._24_4_ = fVar111 * fVar15;
                            auVar156._28_4_ = 0;
                            auVar94 = vfmadd213ps_fma(local_2680,auVar172,auVar156);
                            auVar81 = vfmadd213ps_fma(local_2ea0,auVar133,ZEXT1632(auVar94));
                            auVar134 = vrcpps_avx(auVar132);
                            auVar206._8_4_ = 0x3f800000;
                            auVar206._0_8_ = 0x3f8000003f800000;
                            auVar206._12_4_ = 0x3f800000;
                            auVar206._16_4_ = 0x3f800000;
                            auVar206._20_4_ = 0x3f800000;
                            auVar206._24_4_ = 0x3f800000;
                            auVar206._28_4_ = 0x3f800000;
                            auVar94 = vfnmadd213ps_fma(auVar134,auVar132,auVar206);
                            auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar134,auVar134);
                            auVar99 = ZEXT1632(CONCAT412(auVar94._12_4_ *
                                                         (auVar81._12_4_ + auVar81._12_4_),
                                                         CONCAT48(auVar94._8_4_ *
                                                                  (auVar81._8_4_ + auVar81._8_4_),
                                                                  CONCAT44(auVar94._4_4_ *
                                                                           (auVar81._4_4_ +
                                                                           auVar81._4_4_),
                                                                           auVar94._0_4_ *
                                                                           (auVar81._0_4_ +
                                                                           auVar81._0_4_)))));
                            uVar76 = *(undefined4 *)(local_2e48 + uVar62 * 4 + 0x60);
                            auVar189._4_4_ = uVar76;
                            auVar189._0_4_ = uVar76;
                            auVar189._8_4_ = uVar76;
                            auVar189._12_4_ = uVar76;
                            auVar189._16_4_ = uVar76;
                            auVar189._20_4_ = uVar76;
                            auVar189._24_4_ = uVar76;
                            auVar189._28_4_ = uVar76;
                            uVar76 = *(undefined4 *)(local_2e48 + uVar62 * 4 + 0x100);
                            auVar207._4_4_ = uVar76;
                            auVar207._0_4_ = uVar76;
                            auVar207._8_4_ = uVar76;
                            auVar207._12_4_ = uVar76;
                            auVar207._16_4_ = uVar76;
                            auVar207._20_4_ = uVar76;
                            auVar207._24_4_ = uVar76;
                            auVar207._28_4_ = uVar76;
                            auVar105 = ZEXT3264(auVar207);
                            auVar134 = vcmpps_avx(auVar189,auVar99,2);
                            auVar114 = vcmpps_avx(auVar99,auVar207,2);
                            auVar134 = vandps_avx(auVar114,auVar134);
                            auVar94 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
                            auVar80 = vpand_avx(auVar94,auVar80);
                            auVar114 = vpmovsxwd_avx2(auVar80);
                            auVar134 = local_2dc0;
                            if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0 ||
                                     (auVar114 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar114 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar114 >> 0x7f,0) != '\0') ||
                                  (auVar114 & (undefined1  [32])0x100000000) !=
                                  (undefined1  [32])0x0) || SUB321(auVar114 >> 0xbf,0) != '\0') ||
                                (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                                || auVar114[0x1f] < '\0') {
                              auVar114 = vcmpps_avx(auVar132,_DAT_01f7b000,4);
                              auVar94 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
                              auVar80 = vpand_avx(auVar80,auVar94);
                              auVar114 = vpmovsxwd_avx2(auVar80);
                              if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar114 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar114 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar114 >> 0x7f,0) != '\0')
                                    || (auVar114 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB321(auVar114 >> 0xbf,0) != '\0')
                                  || (auVar114 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0) || auVar114[0x1f] < '\0') {
                                local_2ac0 = local_2dc0;
                                local_2aa0 = &local_2f39;
                                local_2a80 = auVar114;
                                local_2a20 = auVar99;
                                auVar114 = vsubps_avx(local_2dc0,auVar144);
                                local_2b00 = vblendvps_avx(local_2de0,auVar114,local_27a0);
                                auVar114 = vsubps_avx(local_2dc0,local_2de0);
                                local_2ae0 = vblendvps_avx(auVar144,auVar114,local_27a0);
                                fVar79 = local_27c0._0_4_;
                                fVar10 = local_27c0._4_4_;
                                local_2a00._4_4_ = auVar133._4_4_ * fVar10;
                                local_2a00._0_4_ = auVar133._0_4_ * fVar79;
                                fVar11 = local_27c0._8_4_;
                                local_2a00._8_4_ = auVar133._8_4_ * fVar11;
                                fVar12 = local_27c0._12_4_;
                                local_2a00._12_4_ = auVar133._12_4_ * fVar12;
                                fVar13 = local_27c0._16_4_;
                                local_2a00._16_4_ = auVar133._16_4_ * fVar13;
                                fVar14 = local_27c0._20_4_;
                                local_2a00._20_4_ = auVar133._20_4_ * fVar14;
                                fVar15 = local_27c0._24_4_;
                                local_2a00._24_4_ = auVar133._24_4_ * fVar15;
                                local_2a00._28_4_ = local_27a0._28_4_;
                                local_29e0[0] = fVar79 * auVar172._0_4_;
                                local_29e0[1] = fVar10 * auVar172._4_4_;
                                local_29e0[2] = fVar11 * auVar172._8_4_;
                                local_29e0[3] = fVar12 * auVar172._12_4_;
                                fStack_29d0 = fVar13 * auVar172._16_4_;
                                fStack_29cc = fVar14 * auVar172._20_4_;
                                fStack_29c8 = fVar15 * auVar172._24_4_;
                                uStack_29c4 = auVar172._28_4_;
                                local_29c0[0] = fVar79 * fVar93;
                                local_29c0[1] = fVar10 * fVar106;
                                local_29c0[2] = fVar11 * fVar107;
                                local_29c0[3] = fVar12 * fVar108;
                                fStack_29b0 = fVar13 * fVar109;
                                fStack_29ac = fVar14 * fVar110;
                                fStack_29a8 = fVar15 * fVar111;
                                uStack_29a4 = auVar172._28_4_;
                                pGVar4 = (local_2e08->geometries).items[local_2e20].ptr;
                                if ((pGVar4->mask & *(uint *)(local_2e48 + uVar62 * 4 + 0x120)) != 0
                                   ) {
                                  if ((local_2e40->args->filter == (RTCFilterFunctionN)0x0) &&
                                     (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_015d901e:
                                    *(undefined4 *)(local_2ce0 + uVar62 * 4) = 0;
                                    pauVar73 = local_2f38;
                                    NVar74.ptr = local_2f30.ptr;
                                    auVar134 = local_2dc0;
                                  }
                                  else {
                                    auVar84._0_4_ =
                                         (float)(int)(*(ushort *)(local_2e10 + 8 + local_2e18) - 1);
                                    auVar84._4_12_ = local_2720._4_12_;
                                    auVar94 = vrcpss_avx(auVar84,auVar84);
                                    auVar81 = vfnmadd213ss_fma(auVar84,auVar94,
                                                               SUB6416(ZEXT464(0x40000000),0));
                                    fVar79 = auVar94._0_4_ * auVar81._0_4_;
                                    auVar97._0_4_ =
                                         (float)(int)(*(ushort *)(local_2e10 + 10 + local_2e18) - 1)
                                    ;
                                    auVar97._4_12_ = local_2720._4_12_;
                                    auVar94 = vrcpss_avx(auVar97,auVar97);
                                    auVar81 = vfnmadd213ss_fma(auVar97,auVar94,
                                                               SUB6416(ZEXT464(0x40000000),0));
                                    fVar10 = auVar94._0_4_ * auVar81._0_4_;
                                    auVar134 = vrcpps_avx(local_2dc0);
                                    auVar168._8_4_ = 0x3f800000;
                                    auVar168._0_8_ = 0x3f8000003f800000;
                                    auVar168._12_4_ = 0x3f800000;
                                    auVar168._16_4_ = 0x3f800000;
                                    auVar168._20_4_ = 0x3f800000;
                                    auVar168._24_4_ = 0x3f800000;
                                    auVar168._28_4_ = 0x3f800000;
                                    auVar94 = vfnmadd213ps_fma(local_2dc0,auVar134,auVar168);
                                    auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar134,auVar134);
                                    auVar123._8_4_ = 0x219392ef;
                                    auVar123._0_8_ = 0x219392ef219392ef;
                                    auVar123._12_4_ = 0x219392ef;
                                    auVar123._16_4_ = 0x219392ef;
                                    auVar123._20_4_ = 0x219392ef;
                                    auVar123._24_4_ = 0x219392ef;
                                    auVar123._28_4_ = 0x219392ef;
                                    auVar134 = vcmpps_avx(local_2780,auVar123,5);
                                    auVar134 = vandps_avx(ZEXT1632(auVar94),auVar134);
                                    auVar50._4_4_ =
                                         (fVar208 * (float)local_2840._4_4_ + local_2b00._4_4_) *
                                         fVar79 * auVar134._4_4_;
                                    auVar50._0_4_ =
                                         (fVar201 * (float)local_2840._0_4_ + local_2b00._0_4_) *
                                         fVar79 * auVar134._0_4_;
                                    auVar50._8_4_ =
                                         (fVar209 * fStack_2838 + local_2b00._8_4_) * fVar79 *
                                         auVar134._8_4_;
                                    auVar50._12_4_ =
                                         (fVar210 * fStack_2834 + local_2b00._12_4_) * fVar79 *
                                         auVar134._12_4_;
                                    auVar50._16_4_ =
                                         (fStack_2830 * 0.0 + local_2b00._16_4_) * fVar79 *
                                         auVar134._16_4_;
                                    auVar50._20_4_ =
                                         (fStack_282c * 0.0 + local_2b00._20_4_) * fVar79 *
                                         auVar134._20_4_;
                                    auVar50._24_4_ =
                                         (fStack_2828 * 0.0 + local_2b00._24_4_) * fVar79 *
                                         auVar134._24_4_;
                                    auVar50._28_4_ = fVar79;
                                    local_2a60 = vminps_avx(auVar50,auVar168);
                                    auVar51._4_4_ =
                                         (fVar208 * (float)local_2860._4_4_ + local_2ae0._4_4_) *
                                         fVar10 * auVar134._4_4_;
                                    auVar51._0_4_ =
                                         (fVar201 * (float)local_2860._0_4_ + local_2ae0._0_4_) *
                                         fVar10 * auVar134._0_4_;
                                    auVar51._8_4_ =
                                         (fVar209 * fStack_2858 + local_2ae0._8_4_) * fVar10 *
                                         auVar134._8_4_;
                                    auVar51._12_4_ =
                                         (fVar210 * fStack_2854 + local_2ae0._12_4_) * fVar10 *
                                         auVar134._12_4_;
                                    auVar51._16_4_ =
                                         (fStack_2850 * 0.0 + local_2ae0._16_4_) * fVar10 *
                                         auVar134._16_4_;
                                    auVar51._20_4_ =
                                         (fStack_284c * 0.0 + local_2ae0._20_4_) * fVar10 *
                                         auVar134._20_4_;
                                    auVar51._24_4_ =
                                         (fStack_2848 * 0.0 + local_2ae0._24_4_) * fVar10 *
                                         auVar134._24_4_;
                                    auVar51._28_4_ = local_2a60._28_4_;
                                    local_2a40 = vminps_avx(auVar51,auVar168);
                                    auVar80 = vpacksswb_avx(auVar80,auVar80);
                                    uVar66 = 0;
                                    uVar71 = (ulong)(byte)(SUB161(auVar80 >> 7,0) & 1 |
                                                           (SUB161(auVar80 >> 0xf,0) & 1) << 1 |
                                                           (SUB161(auVar80 >> 0x17,0) & 1) << 2 |
                                                           (SUB161(auVar80 >> 0x1f,0) & 1) << 3 |
                                                           (SUB161(auVar80 >> 0x27,0) & 1) << 4 |
                                                           (SUB161(auVar80 >> 0x2f,0) & 1) << 5 |
                                                           (SUB161(auVar80 >> 0x37,0) & 1) << 6 |
                                                          SUB161(auVar80 >> 0x3f,0) << 7);
                                    for (uVar64 = uVar71; (uVar64 & 1) == 0;
                                        uVar64 = uVar64 >> 1 | 0x8000000000000000) {
                                      uVar66 = uVar66 + 1;
                                    }
                                    iVar61 = 1 << ((uint)uVar62 & 0x1f);
                                    auVar92._4_4_ = iVar61;
                                    auVar92._0_4_ = iVar61;
                                    auVar92._8_4_ = iVar61;
                                    auVar92._12_4_ = iVar61;
                                    auVar92._16_4_ = iVar61;
                                    auVar92._20_4_ = iVar61;
                                    auVar92._24_4_ = iVar61;
                                    auVar92._28_4_ = iVar61;
                                    auVar114 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
                                    auVar134 = vpand_avx2(auVar92,auVar114);
                                    _local_2ec0 = vpcmpeqd_avx2(auVar134,auVar114);
                                    local_2f28 = uVar68;
                                    local_2ee0 = auVar207;
                                    while (pauVar73 = local_2f38, NVar74.ptr = local_2f30.ptr,
                                          auVar134 = local_2dc0, uVar71 != 0) {
                                      local_2940 = *(undefined4 *)(local_2a60 + uVar66 * 4);
                                      local_2920 = *(undefined4 *)(local_2a40 + uVar66 * 4);
                                      *(undefined4 *)(pRVar59 + uVar62 * 4 + 0x100) =
                                           *(undefined4 *)(local_2a20 + uVar66 * 4);
                                      fVar79 = local_29e0[uVar66 - 8];
                                      auVar124._4_4_ = fVar79;
                                      auVar124._0_4_ = fVar79;
                                      auVar124._8_4_ = fVar79;
                                      auVar124._12_4_ = fVar79;
                                      auVar124._16_4_ = fVar79;
                                      auVar124._20_4_ = fVar79;
                                      auVar124._24_4_ = fVar79;
                                      auVar124._28_4_ = fVar79;
                                      fVar10 = local_29e0[uVar66];
                                      local_2980._4_4_ = fVar10;
                                      local_2980._0_4_ = fVar10;
                                      local_2980._8_4_ = fVar10;
                                      local_2980._12_4_ = fVar10;
                                      local_2980._16_4_ = fVar10;
                                      local_2980._20_4_ = fVar10;
                                      local_2980._24_4_ = fVar10;
                                      local_2980._28_4_ = fVar10;
                                      fVar10 = local_29c0[uVar66];
                                      local_2960._4_4_ = fVar10;
                                      local_2960._0_4_ = fVar10;
                                      local_2960._8_4_ = fVar10;
                                      local_2960._12_4_ = fVar10;
                                      local_2960._16_4_ = fVar10;
                                      local_2960._20_4_ = fVar10;
                                      local_2960._24_4_ = fVar10;
                                      local_2960._28_4_ = fVar10;
                                      local_2d70.context = pRVar60->user;
                                      local_29a0[0] = (RTCHitN)SUB41(fVar79,0);
                                      local_29a0[1] = (RTCHitN)(char)((uint)fVar79 >> 8);
                                      local_29a0[2] = (RTCHitN)(char)((uint)fVar79 >> 0x10);
                                      local_29a0[3] = (RTCHitN)(char)((uint)fVar79 >> 0x18);
                                      local_29a0[4] = (RTCHitN)SUB41(fVar79,0);
                                      local_29a0[5] = (RTCHitN)(char)((uint)fVar79 >> 8);
                                      local_29a0[6] = (RTCHitN)(char)((uint)fVar79 >> 0x10);
                                      local_29a0[7] = (RTCHitN)(char)((uint)fVar79 >> 0x18);
                                      local_29a0[8] = (RTCHitN)SUB41(fVar79,0);
                                      local_29a0[9] = (RTCHitN)(char)((uint)fVar79 >> 8);
                                      local_29a0[10] = (RTCHitN)(char)((uint)fVar79 >> 0x10);
                                      local_29a0[0xb] = (RTCHitN)(char)((uint)fVar79 >> 0x18);
                                      local_29a0[0xc] = (RTCHitN)SUB41(fVar79,0);
                                      local_29a0[0xd] = (RTCHitN)(char)((uint)fVar79 >> 8);
                                      local_29a0[0xe] = (RTCHitN)(char)((uint)fVar79 >> 0x10);
                                      local_29a0[0xf] = (RTCHitN)(char)((uint)fVar79 >> 0x18);
                                      local_29a0[0x10] = (RTCHitN)SUB41(fVar79,0);
                                      local_29a0[0x11] = (RTCHitN)(char)((uint)fVar79 >> 8);
                                      local_29a0[0x12] = (RTCHitN)(char)((uint)fVar79 >> 0x10);
                                      local_29a0[0x13] = (RTCHitN)(char)((uint)fVar79 >> 0x18);
                                      local_29a0[0x14] = (RTCHitN)SUB41(fVar79,0);
                                      local_29a0[0x15] = (RTCHitN)(char)((uint)fVar79 >> 8);
                                      local_29a0[0x16] = (RTCHitN)(char)((uint)fVar79 >> 0x10);
                                      local_29a0[0x17] = (RTCHitN)(char)((uint)fVar79 >> 0x18);
                                      local_29a0[0x18] = (RTCHitN)SUB41(fVar79,0);
                                      local_29a0[0x19] = (RTCHitN)(char)((uint)fVar79 >> 8);
                                      local_29a0[0x1a] = (RTCHitN)(char)((uint)fVar79 >> 0x10);
                                      local_29a0[0x1b] = (RTCHitN)(char)((uint)fVar79 >> 0x18);
                                      local_29a0[0x1c] = (RTCHitN)SUB41(fVar79,0);
                                      local_29a0[0x1d] = (RTCHitN)(char)((uint)fVar79 >> 8);
                                      local_29a0[0x1e] = (RTCHitN)(char)((uint)fVar79 >> 0x10);
                                      local_29a0[0x1f] = (RTCHitN)(char)((uint)fVar79 >> 0x18);
                                      uStack_293c = local_2940;
                                      uStack_2938 = local_2940;
                                      uStack_2934 = local_2940;
                                      uStack_2930 = local_2940;
                                      uStack_292c = local_2940;
                                      uStack_2928 = local_2940;
                                      uStack_2924 = local_2940;
                                      uStack_291c = local_2920;
                                      uStack_2918 = local_2920;
                                      uStack_2914 = local_2920;
                                      uStack_2910 = local_2920;
                                      uStack_290c = local_2920;
                                      uStack_2908 = local_2920;
                                      uStack_2904 = local_2920;
                                      local_2900 = CONCAT44(uStack_281c,local_2820);
                                      uStack_28f8 = CONCAT44(uStack_2814,uStack_2818);
                                      uStack_28f0 = CONCAT44(uStack_280c,uStack_2810);
                                      uStack_28e8 = CONCAT44(uStack_2804,uStack_2808);
                                      local_28e0 = CONCAT44(uStack_27fc,local_2800);
                                      uStack_28d8 = CONCAT44(uStack_27f4,uStack_27f8);
                                      uStack_28d0 = CONCAT44(uStack_27ec,uStack_27f0);
                                      uStack_28c8 = CONCAT44(uStack_27e4,uStack_27e8);
                                      auVar134 = vpcmpeqd_avx2(auVar124,auVar124);
                                      uStack_28bc = (local_2d70.context)->instID[0];
                                      local_28c0 = uStack_28bc;
                                      uStack_28b8 = uStack_28bc;
                                      uStack_28b4 = uStack_28bc;
                                      uStack_28b0 = uStack_28bc;
                                      uStack_28ac = uStack_28bc;
                                      uStack_28a8 = uStack_28bc;
                                      uStack_28a4 = uStack_28bc;
                                      uStack_289c = (local_2d70.context)->instPrimID[0];
                                      local_28a0 = uStack_289c;
                                      uStack_2898 = uStack_289c;
                                      uStack_2894 = uStack_289c;
                                      uStack_2890 = uStack_289c;
                                      uStack_288c = uStack_289c;
                                      uStack_2888 = uStack_289c;
                                      uStack_2884 = uStack_289c;
                                      local_2d20 = _local_2ec0;
                                      local_2d70.valid = (int *)local_2d20;
                                      local_2d70.geometryUserPtr = pGVar4->userPtr;
                                      local_2d70.ray = (RTCRayN *)pRVar59;
                                      local_2d70.hit = local_29a0;
                                      local_2d70.N = 8;
                                      uVar64 = uVar66;
                                      if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                        local_2ea0._0_8_ = uVar71;
                                        local_2f00._0_8_ = uVar66;
                                        auVar134 = ZEXT1632(auVar134._0_16_);
                                        in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                        in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                        (*pGVar4->occlusionFilterN)(&local_2d70);
                                        auVar105 = ZEXT3264(local_2ee0);
                                        auVar134 = vpcmpeqd_avx2(auVar134,auVar134);
                                        uVar71 = local_2ea0._0_8_;
                                        uVar68 = local_2f28;
                                        uVar62 = local_2da0._0_8_;
                                        uVar64 = local_2f00._0_8_;
                                      }
                                      auVar99 = vpcmpeqd_avx2(local_2d20,_DAT_01f7b000);
                                      auVar114 = auVar134 & ~auVar99;
                                      if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (auVar114 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar114 >> 0x5f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             SUB321(auVar114 >> 0x7f,0) == '\0') &&
                                            (auVar114 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar114 >> 0xbf,0) == '\0') &&
                                          (auVar114 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) && -1 < auVar114[0x1f]) {
                                        auVar99 = auVar99 ^ auVar134;
                                      }
                                      else {
                                        p_Var9 = pRVar60->args->filter;
                                        if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                           (((pRVar60->args->flags &
                                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                            (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                          local_2ea0._0_8_ = uVar71;
                                          local_2f00._0_8_ = uVar64;
                                          auVar134 = ZEXT1632(auVar134._0_16_);
                                          in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                          in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                          (*p_Var9)(&local_2d70);
                                          auVar105 = ZEXT3264(local_2ee0);
                                          auVar134 = vpcmpeqd_avx2(auVar134,auVar134);
                                          uVar71 = local_2ea0._0_8_;
                                          uVar68 = local_2f28;
                                          uVar62 = local_2da0._0_8_;
                                          uVar64 = local_2f00._0_8_;
                                        }
                                        auVar114 = vpcmpeqd_avx2(local_2d20,_DAT_01f7b000);
                                        auVar99 = auVar114 ^ auVar134;
                                        auVar125._8_4_ = 0xff800000;
                                        auVar125._0_8_ = 0xff800000ff800000;
                                        auVar125._12_4_ = 0xff800000;
                                        auVar125._16_4_ = 0xff800000;
                                        auVar125._20_4_ = 0xff800000;
                                        auVar125._24_4_ = 0xff800000;
                                        auVar125._28_4_ = 0xff800000;
                                        auVar134 = vblendvps_avx(auVar125,*(undefined1 (*) [32])
                                                                           (local_2d70.ray + 0x100),
                                                                 auVar114);
                                        *(undefined1 (*) [32])(local_2d70.ray + 0x100) = auVar134;
                                      }
                                      if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0 ||
                                               (auVar99 >> 0x3f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar99 >> 0x5f & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             SUB321(auVar99 >> 0x7f,0) != '\0') ||
                                            (auVar99 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) ||
                                           SUB321(auVar99 >> 0xbf,0) != '\0') ||
                                          (auVar99 & (undefined1  [32])0x100000000) !=
                                          (undefined1  [32])0x0) || auVar99[0x1f] < '\0')
                                      goto LAB_015d901e;
                                      *(int *)(local_2f08 + uVar62 * 4) = auVar105._0_4_;
                                      uVar66 = 0;
                                      uVar71 = uVar71 ^ 1L << (uVar64 & 0x3f);
                                      for (uVar64 = uVar71; (uVar64 & 1) == 0;
                                          uVar64 = uVar64 >> 1 | 0x8000000000000000) {
                                        uVar66 = uVar66 + 1;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                        auVar134 = local_2d40 & local_2ce0;
                        bVar78 = (((((((auVar134 >> 0x1f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0 &&
                                      (auVar134 >> 0x3f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar134 >> 0x5f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) && SUB321(auVar134 >> 0x7f,0) == '\0')
                                   && (auVar134 & (undefined1  [32])0x100000000) ==
                                      (undefined1  [32])0x0) && SUB321(auVar134 >> 0xbf,0) == '\0')
                                 && (auVar134 & (undefined1  [32])0x100000000) ==
                                    (undefined1  [32])0x0) && -1 < auVar134[0x1f];
                        auVar134 = vandps_avx(local_2ce0,local_2d40);
                        lVar69 = local_2e58;
                      }
                      auVar105 = ZEXT3264(local_2d40);
                      uVar68 = local_2e50 - 1 & local_2e50;
                      local_2d40 = auVar134;
                    } while ((uVar68 != 0) && (!bVar78));
                  }
                  auVar134 = local_2d40;
                  lVar69 = local_2e60 + 1;
                }
                auVar114 = vpcmpeqd_avx2(auVar105._0_32_,auVar105._0_32_);
                local_2e00 = vpor_avx2(auVar134 ^ auVar114,local_2e00);
                auVar114 = auVar114 & ~local_2e00;
                if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar114 >> 0x7f,0) == '\0') &&
                      (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar114 >> 0xbf,0) == '\0') &&
                    (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar114[0x1f]) goto LAB_015d94d1;
                auVar126._8_4_ = 0xff800000;
                auVar126._0_8_ = 0xff800000ff800000;
                auVar126._12_4_ = 0xff800000;
                auVar126._16_4_ = 0xff800000;
                auVar126._20_4_ = 0xff800000;
                auVar126._24_4_ = 0xff800000;
                auVar126._28_4_ = 0xff800000;
                local_2b20 = vblendvps_avx(local_2b20,auVar126,local_2e00);
              }
              goto LAB_015d7fc4;
            }
            uVar62 = local_2f30.ptr & 0xfffffffffffffff0;
            auVar134 = vcmpps_avx(local_2b20,auVar105._0_32_,6);
            auVar105 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            local_2f30.ptr = 8;
            for (lVar69 = -0x10;
                (auVar114 = auVar105._0_32_, lVar69 != 0 &&
                (uVar68 = *(ulong *)(uVar62 + 0x20 + lVar69 * 2), uVar68 != 8)); lVar69 = lVar69 + 4
                ) {
              uVar76 = *(undefined4 *)(uVar62 + 0x90 + lVar69);
              auVar115._4_4_ = uVar76;
              auVar115._0_4_ = uVar76;
              auVar115._8_4_ = uVar76;
              auVar115._12_4_ = uVar76;
              auVar115._16_4_ = uVar76;
              auVar115._20_4_ = uVar76;
              auVar115._24_4_ = uVar76;
              auVar115._28_4_ = uVar76;
              uVar76 = *(undefined4 *)(uVar62 + 0x30 + lVar69);
              auVar135._4_4_ = uVar76;
              auVar135._0_4_ = uVar76;
              auVar135._8_4_ = uVar76;
              auVar135._12_4_ = uVar76;
              auVar135._16_4_ = uVar76;
              auVar135._20_4_ = uVar76;
              auVar135._24_4_ = uVar76;
              auVar135._28_4_ = uVar76;
              auVar99 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar76 = *(undefined4 *)(uVar62 + 0xb0 + lVar69);
              auVar145._4_4_ = uVar76;
              auVar145._0_4_ = uVar76;
              auVar145._8_4_ = uVar76;
              auVar145._12_4_ = uVar76;
              auVar145._16_4_ = uVar76;
              auVar145._20_4_ = uVar76;
              auVar145._24_4_ = uVar76;
              auVar145._28_4_ = uVar76;
              auVar80 = vfmadd231ps_fma(auVar135,auVar99,auVar115);
              uVar76 = *(undefined4 *)(uVar62 + 0x50 + lVar69);
              auVar116._4_4_ = uVar76;
              auVar116._0_4_ = uVar76;
              auVar116._8_4_ = uVar76;
              auVar116._12_4_ = uVar76;
              auVar116._16_4_ = uVar76;
              auVar116._20_4_ = uVar76;
              auVar116._24_4_ = uVar76;
              auVar116._28_4_ = uVar76;
              auVar94 = vfmadd231ps_fma(auVar116,auVar99,auVar145);
              uVar76 = *(undefined4 *)(uVar62 + 0xd0 + lVar69);
              auVar146._4_4_ = uVar76;
              auVar146._0_4_ = uVar76;
              auVar146._8_4_ = uVar76;
              auVar146._12_4_ = uVar76;
              auVar146._16_4_ = uVar76;
              auVar146._20_4_ = uVar76;
              auVar146._24_4_ = uVar76;
              auVar146._28_4_ = uVar76;
              uVar76 = *(undefined4 *)(uVar62 + 0x70 + lVar69);
              auVar161._4_4_ = uVar76;
              auVar161._0_4_ = uVar76;
              auVar161._8_4_ = uVar76;
              auVar161._12_4_ = uVar76;
              auVar161._16_4_ = uVar76;
              auVar161._20_4_ = uVar76;
              auVar161._24_4_ = uVar76;
              auVar161._28_4_ = uVar76;
              uVar76 = *(undefined4 *)(uVar62 + 0xa0 + lVar69);
              auVar173._4_4_ = uVar76;
              auVar173._0_4_ = uVar76;
              auVar173._8_4_ = uVar76;
              auVar173._12_4_ = uVar76;
              auVar173._16_4_ = uVar76;
              auVar173._20_4_ = uVar76;
              auVar173._24_4_ = uVar76;
              auVar173._28_4_ = uVar76;
              uVar76 = *(undefined4 *)(uVar62 + 0x40 + lVar69);
              auVar184._4_4_ = uVar76;
              auVar184._0_4_ = uVar76;
              auVar184._8_4_ = uVar76;
              auVar184._12_4_ = uVar76;
              auVar184._16_4_ = uVar76;
              auVar184._20_4_ = uVar76;
              auVar184._24_4_ = uVar76;
              auVar184._28_4_ = uVar76;
              auVar81 = vfmadd231ps_fma(auVar161,auVar99,auVar146);
              auVar82 = vfmadd231ps_fma(auVar184,auVar99,auVar173);
              uVar76 = *(undefined4 *)(uVar62 + 0xc0 + lVar69);
              auVar147._4_4_ = uVar76;
              auVar147._0_4_ = uVar76;
              auVar147._8_4_ = uVar76;
              auVar147._12_4_ = uVar76;
              auVar147._16_4_ = uVar76;
              auVar147._20_4_ = uVar76;
              auVar147._24_4_ = uVar76;
              auVar147._28_4_ = uVar76;
              uVar76 = *(undefined4 *)(uVar62 + 0x60 + lVar69);
              auVar174._4_4_ = uVar76;
              auVar174._0_4_ = uVar76;
              auVar174._8_4_ = uVar76;
              auVar174._12_4_ = uVar76;
              auVar174._16_4_ = uVar76;
              auVar174._20_4_ = uVar76;
              auVar174._24_4_ = uVar76;
              auVar174._28_4_ = uVar76;
              uVar76 = *(undefined4 *)(uVar62 + 0xe0 + lVar69);
              auVar192._4_4_ = uVar76;
              auVar192._0_4_ = uVar76;
              auVar192._8_4_ = uVar76;
              auVar192._12_4_ = uVar76;
              auVar192._16_4_ = uVar76;
              auVar192._20_4_ = uVar76;
              auVar192._24_4_ = uVar76;
              auVar192._28_4_ = uVar76;
              auVar95 = vfmadd231ps_fma(auVar174,auVar99,auVar147);
              uVar76 = *(undefined4 *)(uVar62 + 0x80 + lVar69);
              auVar148._4_4_ = uVar76;
              auVar148._0_4_ = uVar76;
              auVar148._8_4_ = uVar76;
              auVar148._12_4_ = uVar76;
              auVar148._16_4_ = uVar76;
              auVar148._20_4_ = uVar76;
              auVar148._24_4_ = uVar76;
              auVar148._28_4_ = uVar76;
              auVar96 = vfmadd231ps_fma(auVar148,auVar99,auVar192);
              auVar52._8_8_ = local_2cc0._8_8_;
              auVar52._0_8_ = local_2cc0._0_8_;
              auVar52._16_8_ = local_2cc0._16_8_;
              auVar52._24_8_ = local_2cc0._24_8_;
              auVar54._8_8_ = local_2cc0._40_8_;
              auVar54._0_8_ = local_2cc0._32_8_;
              auVar54._16_8_ = local_2cc0._48_8_;
              auVar54._24_8_ = local_2cc0._56_8_;
              auVar56._8_8_ = local_2cc0._72_8_;
              auVar56._0_8_ = local_2cc0._64_8_;
              auVar56._16_8_ = local_2cc0._80_8_;
              auVar56._24_8_ = local_2cc0._88_8_;
              auVar132 = vsubps_avx(ZEXT1632(auVar80),auVar52);
              auVar23._4_4_ = (float)local_2c00._4_4_ * auVar132._4_4_;
              auVar23._0_4_ = (float)local_2c00._0_4_ * auVar132._0_4_;
              auVar23._8_4_ = fStack_2bf8 * auVar132._8_4_;
              auVar23._12_4_ = fStack_2bf4 * auVar132._12_4_;
              auVar23._16_4_ = fStack_2bf0 * auVar132._16_4_;
              auVar23._20_4_ = fStack_2bec * auVar132._20_4_;
              auVar23._24_4_ = fStack_2be8 * auVar132._24_4_;
              auVar23._28_4_ = auVar132._28_4_;
              auVar132 = vsubps_avx(ZEXT1632(auVar94),auVar54);
              auVar105._0_4_ = local_2be0._0_4_ * auVar132._0_4_;
              auVar105._4_4_ = local_2be0._4_4_ * auVar132._4_4_;
              auVar105._8_4_ = local_2be0._8_4_ * auVar132._8_4_;
              auVar105._12_4_ = local_2be0._12_4_ * auVar132._12_4_;
              auVar105._16_4_ = local_2be0._16_4_ * auVar132._16_4_;
              auVar105._20_4_ = local_2be0._20_4_ * auVar132._20_4_;
              auVar105._28_36_ = in_ZMM13._28_36_;
              auVar105._24_4_ = local_2be0._24_4_ * auVar132._24_4_;
              auVar144 = auVar105._0_32_;
              in_ZMM13 = ZEXT3264(auVar144);
              auVar132 = vsubps_avx(ZEXT1632(auVar81),auVar56);
              auVar222._0_4_ = auVar132._0_4_ * (float)local_2bc0._0_4_;
              auVar222._4_4_ = auVar132._4_4_ * (float)local_2bc0._4_4_;
              auVar222._8_4_ = auVar132._8_4_ * fStack_2bb8;
              auVar222._12_4_ = auVar132._12_4_ * fStack_2bb4;
              auVar222._16_4_ = auVar132._16_4_ * fStack_2bb0;
              auVar222._20_4_ = auVar132._20_4_ * fStack_2bac;
              auVar222._28_36_ = in_ZMM14._28_36_;
              auVar222._24_4_ = auVar132._24_4_ * fStack_2ba8;
              auVar172 = auVar222._0_32_;
              in_ZMM14 = ZEXT3264(auVar172);
              auVar132 = vsubps_avx(ZEXT1632(auVar82),auVar52);
              auVar185._0_4_ = (float)local_2c00._0_4_ * auVar132._0_4_;
              auVar185._4_4_ = (float)local_2c00._4_4_ * auVar132._4_4_;
              auVar185._8_4_ = fStack_2bf8 * auVar132._8_4_;
              auVar185._12_4_ = fStack_2bf4 * auVar132._12_4_;
              auVar185._16_4_ = fStack_2bf0 * auVar132._16_4_;
              auVar185._20_4_ = fStack_2bec * auVar132._20_4_;
              auVar185._24_4_ = fStack_2be8 * auVar132._24_4_;
              auVar185._28_4_ = 0;
              auVar132 = vsubps_avx(ZEXT1632(auVar95),auVar54);
              auVar175._0_4_ = local_2be0._0_4_ * auVar132._0_4_;
              auVar175._4_4_ = local_2be0._4_4_ * auVar132._4_4_;
              auVar175._8_4_ = local_2be0._8_4_ * auVar132._8_4_;
              auVar175._12_4_ = local_2be0._12_4_ * auVar132._12_4_;
              auVar175._16_4_ = local_2be0._16_4_ * auVar132._16_4_;
              auVar175._20_4_ = local_2be0._20_4_ * auVar132._20_4_;
              auVar175._24_4_ = local_2be0._24_4_ * auVar132._24_4_;
              auVar175._28_4_ = 0;
              auVar132 = vsubps_avx(ZEXT1632(auVar96),auVar56);
              auVar149._0_4_ = auVar132._0_4_ * (float)local_2bc0._0_4_;
              auVar149._4_4_ = auVar132._4_4_ * (float)local_2bc0._4_4_;
              auVar149._8_4_ = auVar132._8_4_ * fStack_2bb8;
              auVar149._12_4_ = auVar132._12_4_ * fStack_2bb4;
              auVar149._16_4_ = auVar132._16_4_ * fStack_2bb0;
              auVar149._20_4_ = auVar132._20_4_ * fStack_2bac;
              auVar149._24_4_ = auVar132._24_4_ * fStack_2ba8;
              auVar149._28_4_ = 0;
              auVar132 = vpminsd_avx2(auVar23,auVar185);
              auVar133 = vpminsd_avx2(auVar144,auVar175);
              auVar132 = vpmaxsd_avx2(auVar132,auVar133);
              auVar133 = vpminsd_avx2(auVar172,auVar149);
              auVar132 = vpmaxsd_avx2(auVar132,auVar133);
              auVar24._4_4_ = auVar132._4_4_ * 0.99999964;
              auVar24._0_4_ = auVar132._0_4_ * 0.99999964;
              auVar24._8_4_ = auVar132._8_4_ * 0.99999964;
              auVar24._12_4_ = auVar132._12_4_ * 0.99999964;
              auVar24._16_4_ = auVar132._16_4_ * 0.99999964;
              auVar24._20_4_ = auVar132._20_4_ * 0.99999964;
              auVar24._24_4_ = auVar132._24_4_ * 0.99999964;
              auVar24._28_4_ = auVar132._28_4_;
              auVar132 = vpmaxsd_avx2(auVar23,auVar185);
              auVar133 = vpmaxsd_avx2(auVar144,auVar175);
              auVar133 = vpminsd_avx2(auVar132,auVar133);
              auVar132 = vpmaxsd_avx2(auVar172,auVar149);
              auVar132 = vpminsd_avx2(auVar133,auVar132);
              auVar25._4_4_ = auVar132._4_4_ * 1.0000004;
              auVar25._0_4_ = auVar132._0_4_ * 1.0000004;
              auVar25._8_4_ = auVar132._8_4_ * 1.0000004;
              auVar25._12_4_ = auVar132._12_4_ * 1.0000004;
              auVar25._16_4_ = auVar132._16_4_ * 1.0000004;
              auVar25._20_4_ = auVar132._20_4_ * 1.0000004;
              auVar25._24_4_ = auVar132._24_4_ * 1.0000004;
              auVar25._28_4_ = auVar132._28_4_;
              auVar132 = vpmaxsd_avx2(auVar24,local_2b40);
              auVar133 = vpminsd_avx2(auVar25,local_2b20);
              auVar132 = vcmpps_avx(auVar132,auVar133,2);
              if ((uVar67 & 7) == 6) {
                uVar76 = *(undefined4 *)(uVar62 + 0xf0 + lVar69);
                auVar150._4_4_ = uVar76;
                auVar150._0_4_ = uVar76;
                auVar150._8_4_ = uVar76;
                auVar150._12_4_ = uVar76;
                auVar150._16_4_ = uVar76;
                auVar150._20_4_ = uVar76;
                auVar150._24_4_ = uVar76;
                auVar150._28_4_ = uVar76;
                auVar133 = vcmpps_avx(auVar150,auVar99,2);
                uVar76 = *(undefined4 *)(uVar62 + 0x100 + lVar69);
                auVar162._4_4_ = uVar76;
                auVar162._0_4_ = uVar76;
                auVar162._8_4_ = uVar76;
                auVar162._12_4_ = uVar76;
                auVar162._16_4_ = uVar76;
                auVar162._20_4_ = uVar76;
                auVar162._24_4_ = uVar76;
                auVar162._28_4_ = uVar76;
                auVar99 = vcmpps_avx(auVar99,auVar162,1);
                auVar99 = vandps_avx(auVar133,auVar99);
                auVar99 = vandps_avx(auVar99,auVar132);
                auVar80 = vpackssdw_avx(auVar99._0_16_,auVar99._16_16_);
              }
              else {
                auVar80 = vpackssdw_avx(auVar132._0_16_,auVar132._16_16_);
              }
              auVar94 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
              auVar80 = vpand_avx(auVar80,auVar94);
              auVar99 = vpmovzxwd_avx2(auVar80);
              auVar99 = vpslld_avx2(auVar99,0x1f);
              if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar99 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar99 >> 0x7f,0) == '\0') &&
                    (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar99 >> 0xbf,0) == '\0') &&
                  (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar99[0x1f]) {
                auVar105 = ZEXT3264(auVar114);
                uVar68 = local_2f30.ptr;
              }
              else {
                auVar136._8_4_ = 0x7f800000;
                auVar136._0_8_ = 0x7f8000007f800000;
                auVar136._12_4_ = 0x7f800000;
                auVar136._16_4_ = 0x7f800000;
                auVar136._20_4_ = 0x7f800000;
                auVar136._24_4_ = 0x7f800000;
                auVar136._28_4_ = 0x7f800000;
                auVar99 = vblendvps_avx(auVar136,auVar24,auVar99);
                auVar105 = ZEXT3264(auVar99);
                if (local_2f30.ptr != 8) {
                  *puVar75 = local_2f30.ptr;
                  puVar75 = puVar75 + 1;
                  *pauVar73 = auVar114;
                  pauVar73 = pauVar73 + 1;
                }
              }
              local_2f30.ptr = uVar68;
            }
            if (local_2f30.ptr == 8) goto LAB_015d82a5;
            auVar134 = vcmpps_avx(local_2b20,auVar114,6);
            uVar76 = vmovmskps_avx(auVar134);
          } while ((byte)local_2f20 < (byte)POPCOUNT(uVar76));
          *puVar75 = local_2f30.ptr;
          puVar75 = puVar75 + 1;
          *pauVar73 = auVar114;
          pauVar73 = pauVar73 + 1;
LAB_015d82a5:
          iVar61 = 4;
          local_2f38 = pauVar73;
        }
        else {
          while (local_2da0 = auVar134, unaff_R14 != 0) {
            local_2f28 = 0;
            for (uVar62 = unaff_R14; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
              local_2f28 = local_2f28 + 1;
            }
            unaff_R14 = unaff_R14 - 1 & unaff_R14;
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            bVar78 = occluded1(local_2e70,local_2e78,local_2f30,local_2f28,&local_2f3a,ray,
                               (TravRayK<8,_true> *)&local_2cc0.field_0,context);
            auVar134 = local_2da0;
            if (bVar78) {
              *(undefined4 *)(local_2e00 + local_2f28 * 4) = 0xffffffff;
              auVar134 = local_2da0;
            }
          }
          auVar134 = _DAT_01f7b020 & ~local_2e00;
          iVar61 = 3;
          if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar134 >> 0x7f,0) != '\0') ||
                (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar134 >> 0xbf,0) != '\0') ||
              (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar134[0x1f] < '\0') {
            auVar127._8_4_ = 0xff800000;
            auVar127._0_8_ = 0xff800000ff800000;
            auVar127._12_4_ = 0xff800000;
            auVar127._16_4_ = 0xff800000;
            auVar127._20_4_ = 0xff800000;
            auVar127._24_4_ = 0xff800000;
            auVar127._28_4_ = 0xff800000;
            local_2b20 = vblendvps_avx(local_2b20,auVar127,local_2e00);
            iVar61 = 2;
          }
          unaff_R14 = 0;
          auVar134 = local_2da0;
          if ((uint)local_2f20 < (uint)POPCOUNT(uVar76)) goto LAB_015d800e;
        }
        pauVar73 = local_2f38;
      } while (iVar61 != 3);
LAB_015d94d1:
      auVar134 = vandps_avx(local_2880,local_2e00);
      auVar104._8_4_ = 0xff800000;
      auVar104._0_8_ = 0xff800000ff800000;
      auVar104._12_4_ = 0xff800000;
      auVar104._16_4_ = 0xff800000;
      auVar104._20_4_ = 0xff800000;
      auVar104._24_4_ = 0xff800000;
      auVar104._28_4_ = 0xff800000;
      auVar134 = vmaskmovps_avx(auVar134,auVar104);
      *(undefined1 (*) [32])local_2f08 = auVar134;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }